

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  uint uVar62;
  int iVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  long lVar68;
  byte bVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  float t1;
  float fVar85;
  undefined1 auVar76 [16];
  float fVar73;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar74;
  undefined1 auVar80 [16];
  float fVar75;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [16];
  float fVar102;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar101;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar155;
  float fVar156;
  vfloat4 b0;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar157;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar158;
  float fVar159;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar160;
  undefined8 uVar161;
  float fVar183;
  vfloat4 b0_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar180;
  float fVar185;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar182;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar181;
  float fVar184;
  float fVar186;
  undefined1 auVar179 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  vfloat4 a0_2;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  vfloat4 a0_3;
  undefined1 auVar231 [16];
  float fVar239;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 in_ZMM10 [64];
  undefined1 auVar237 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  float fVar250;
  vfloat4 a0_1;
  undefined1 auVar251 [16];
  float fVar265;
  undefined1 auVar252 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar264;
  undefined1 in_ZMM12 [64];
  undefined1 auVar262 [64];
  vfloat4 a0;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  float local_6e0;
  float fStack_6dc;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  RTCFilterFunctionNArguments local_640;
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  uint uStack_3a0;
  float afStack_39c [7];
  undefined1 local_380 [32];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar67;
  undefined1 auVar126 [32];
  
  PVar7 = prim[1];
  uVar72 = (ulong)(byte)PVar7;
  fVar73 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar13 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  auVar76._0_4_ = fVar73 * auVar13._0_4_;
  auVar76._4_4_ = fVar73 * auVar13._4_4_;
  auVar76._8_4_ = fVar73 * auVar13._8_4_;
  auVar76._12_4_ = fVar73 * auVar13._12_4_;
  auVar209._0_4_ = fVar73 * auVar14._0_4_;
  auVar209._4_4_ = fVar73 * auVar14._4_4_;
  auVar209._8_4_ = fVar73 * auVar14._8_4_;
  auVar209._12_4_ = fVar73 * auVar14._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar13);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar15 = vpmovsxbd_avx2(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar278._8_8_ = 0;
  auVar278._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar83 = vpmovsxbd_avx2(auVar278);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar16 = vpmovsxbd_avx2(auVar3);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar17 = vpmovsxbd_avx2(auVar4);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar72 + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar66 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar19 = vpmovsxbd_avx2(auVar6);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar66 + uVar72 + 6);
  auVar20 = vpmovsxbd_avx2(auVar221);
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar66 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar261 = vpmovsxbd_avx2(auVar108);
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar280._4_4_ = auVar209._0_4_;
  auVar280._0_4_ = auVar209._0_4_;
  auVar280._8_4_ = auVar209._0_4_;
  auVar280._12_4_ = auVar209._0_4_;
  auVar280._16_4_ = auVar209._0_4_;
  auVar280._20_4_ = auVar209._0_4_;
  auVar280._24_4_ = auVar209._0_4_;
  auVar280._28_4_ = auVar209._0_4_;
  auVar13 = vmovshdup_avx(auVar209);
  uVar161 = auVar13._0_8_;
  auVar289._8_8_ = uVar161;
  auVar289._0_8_ = uVar161;
  auVar289._16_8_ = uVar161;
  auVar289._24_8_ = uVar161;
  auVar13 = vshufps_avx(auVar209,auVar209,0xaa);
  fVar73 = auVar13._0_4_;
  auVar262._0_4_ = fVar73 * auVar83._0_4_;
  fVar85 = auVar13._4_4_;
  auVar262._4_4_ = fVar85 * auVar83._4_4_;
  auVar262._8_4_ = fVar73 * auVar83._8_4_;
  auVar262._12_4_ = fVar85 * auVar83._12_4_;
  auVar262._16_4_ = fVar73 * auVar83._16_4_;
  auVar262._20_4_ = fVar85 * auVar83._20_4_;
  auVar262._28_36_ = in_ZMM12._28_36_;
  auVar262._24_4_ = fVar73 * auVar83._24_4_;
  auVar237._0_4_ = auVar18._0_4_ * fVar73;
  auVar237._4_4_ = auVar18._4_4_ * fVar85;
  auVar237._8_4_ = auVar18._8_4_ * fVar73;
  auVar237._12_4_ = auVar18._12_4_ * fVar85;
  auVar237._16_4_ = auVar18._16_4_ * fVar73;
  auVar237._20_4_ = auVar18._20_4_ * fVar85;
  auVar237._28_36_ = in_ZMM10._28_36_;
  auVar237._24_4_ = auVar18._24_4_ * fVar73;
  auVar229._0_4_ = auVar261._0_4_ * fVar73;
  auVar229._4_4_ = auVar261._4_4_ * fVar85;
  auVar229._8_4_ = auVar261._8_4_ * fVar73;
  auVar229._12_4_ = auVar261._12_4_ * fVar85;
  auVar229._16_4_ = auVar261._16_4_ * fVar73;
  auVar229._20_4_ = auVar261._20_4_ * fVar85;
  auVar229._24_4_ = auVar261._24_4_ * fVar73;
  auVar229._28_4_ = 0;
  auVar13 = vfmadd231ps_fma(auVar262._0_32_,auVar289,auVar15);
  auVar14 = vfmadd231ps_fma(auVar237._0_32_,auVar289,auVar17);
  auVar278 = vfmadd231ps_fma(auVar229,auVar20,auVar289);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar280,auVar81);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar280,auVar16);
  auVar278 = vfmadd231ps_fma(ZEXT1632(auVar278),auVar19,auVar280);
  auVar281._4_4_ = auVar76._0_4_;
  auVar281._0_4_ = auVar76._0_4_;
  auVar281._8_4_ = auVar76._0_4_;
  auVar281._12_4_ = auVar76._0_4_;
  auVar281._16_4_ = auVar76._0_4_;
  auVar281._20_4_ = auVar76._0_4_;
  auVar281._24_4_ = auVar76._0_4_;
  auVar281._28_4_ = auVar76._0_4_;
  auVar13 = vmovshdup_avx(auVar76);
  uVar161 = auVar13._0_8_;
  auVar290._8_8_ = uVar161;
  auVar290._0_8_ = uVar161;
  auVar290._16_8_ = uVar161;
  auVar290._24_8_ = uVar161;
  auVar13 = vshufps_avx(auVar76,auVar76,0xaa);
  fVar73 = auVar13._0_4_;
  auVar201._0_4_ = fVar73 * auVar83._0_4_;
  fVar85 = auVar13._4_4_;
  auVar201._4_4_ = fVar85 * auVar83._4_4_;
  auVar201._8_4_ = fVar73 * auVar83._8_4_;
  auVar201._12_4_ = fVar85 * auVar83._12_4_;
  auVar201._16_4_ = fVar73 * auVar83._16_4_;
  auVar201._20_4_ = fVar85 * auVar83._20_4_;
  auVar201._24_4_ = fVar73 * auVar83._24_4_;
  auVar201._28_4_ = 0;
  auVar23._4_4_ = auVar18._4_4_ * fVar85;
  auVar23._0_4_ = auVar18._0_4_ * fVar73;
  auVar23._8_4_ = auVar18._8_4_ * fVar73;
  auVar23._12_4_ = auVar18._12_4_ * fVar85;
  auVar23._16_4_ = auVar18._16_4_ * fVar73;
  auVar23._20_4_ = auVar18._20_4_ * fVar85;
  auVar23._24_4_ = auVar18._24_4_ * fVar73;
  auVar23._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar261._4_4_ * fVar85;
  auVar83._0_4_ = auVar261._0_4_ * fVar73;
  auVar83._8_4_ = auVar261._8_4_ * fVar73;
  auVar83._12_4_ = auVar261._12_4_ * fVar85;
  auVar83._16_4_ = auVar261._16_4_ * fVar73;
  auVar83._20_4_ = auVar261._20_4_ * fVar85;
  auVar83._24_4_ = auVar261._24_4_ * fVar73;
  auVar83._28_4_ = fVar85;
  auVar13 = vfmadd231ps_fma(auVar201,auVar290,auVar15);
  auVar4 = vfmadd231ps_fma(auVar23,auVar290,auVar17);
  auVar5 = vfmadd231ps_fma(auVar83,auVar290,auVar20);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar281,auVar81);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar281,auVar16);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar139._8_4_ = 0x219392ef;
  auVar139._0_8_ = 0x219392ef219392ef;
  auVar139._12_4_ = 0x219392ef;
  auVar139._16_4_ = 0x219392ef;
  auVar139._20_4_ = 0x219392ef;
  auVar139._24_4_ = 0x219392ef;
  auVar139._28_4_ = 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar3),auVar112);
  auVar81 = vcmpps_avx(auVar81,auVar139,1);
  auVar15 = vblendvps_avx(ZEXT1632(auVar3),auVar139,auVar81);
  auVar81 = vandps_avx(ZEXT1632(auVar14),auVar112);
  auVar81 = vcmpps_avx(auVar81,auVar139,1);
  auVar83 = vblendvps_avx(ZEXT1632(auVar14),auVar139,auVar81);
  auVar81 = vandps_avx(ZEXT1632(auVar278),auVar112);
  auVar81 = vcmpps_avx(auVar81,auVar139,1);
  auVar81 = vblendvps_avx(ZEXT1632(auVar278),auVar139,auVar81);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar281,auVar19);
  auVar16 = vrcpps_avx(auVar15);
  auVar153._8_4_ = 0x3f800000;
  auVar153._0_8_ = &DAT_3f8000003f800000;
  auVar153._12_4_ = 0x3f800000;
  auVar153._16_4_ = 0x3f800000;
  auVar153._20_4_ = 0x3f800000;
  auVar153._24_4_ = 0x3f800000;
  auVar153._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar15,auVar16,auVar153);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar16,auVar16);
  auVar15 = vrcpps_avx(auVar83);
  auVar14 = vfnmadd213ps_fma(auVar83,auVar15,auVar153);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar81);
  auVar278 = vfnmadd213ps_fma(auVar81,auVar15,auVar153);
  auVar278 = vfmadd132ps_fma(ZEXT1632(auVar278),auVar15,auVar15);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar6));
  auVar16._4_4_ = auVar13._4_4_ * auVar81._4_4_;
  auVar16._0_4_ = auVar13._0_4_ * auVar81._0_4_;
  auVar16._8_4_ = auVar13._8_4_ * auVar81._8_4_;
  auVar16._12_4_ = auVar13._12_4_ * auVar81._12_4_;
  auVar16._16_4_ = auVar81._16_4_ * 0.0;
  auVar16._20_4_ = auVar81._20_4_ * 0.0;
  auVar16._24_4_ = auVar81._24_4_ * 0.0;
  auVar16._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar6));
  auVar17._4_4_ = auVar13._4_4_ * auVar81._4_4_;
  auVar17._0_4_ = auVar13._0_4_ * auVar81._0_4_;
  auVar17._8_4_ = auVar13._8_4_ * auVar81._8_4_;
  auVar17._12_4_ = auVar13._12_4_ * auVar81._12_4_;
  auVar17._16_4_ = auVar81._16_4_ * 0.0;
  auVar17._20_4_ = auVar81._20_4_ * 0.0;
  auVar17._24_4_ = auVar81._24_4_ * 0.0;
  auVar17._28_4_ = auVar81._28_4_;
  auVar97._1_3_ = 0;
  auVar97[0] = PVar7;
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar72 * -2 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar4));
  auVar18._4_4_ = auVar81._4_4_ * auVar14._4_4_;
  auVar18._0_4_ = auVar81._0_4_ * auVar14._0_4_;
  auVar18._8_4_ = auVar81._8_4_ * auVar14._8_4_;
  auVar18._12_4_ = auVar81._12_4_ * auVar14._12_4_;
  auVar18._16_4_ = auVar81._16_4_ * 0.0;
  auVar18._20_4_ = auVar81._20_4_ * 0.0;
  auVar18._24_4_ = auVar81._24_4_ * 0.0;
  auVar18._28_4_ = auVar81._28_4_;
  auVar81 = vcvtdq2ps_avx(auVar15);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar4));
  auVar19._4_4_ = auVar14._4_4_ * auVar81._4_4_;
  auVar19._0_4_ = auVar14._0_4_ * auVar81._0_4_;
  auVar19._8_4_ = auVar14._8_4_ * auVar81._8_4_;
  auVar19._12_4_ = auVar14._12_4_ * auVar81._12_4_;
  auVar19._16_4_ = auVar81._16_4_ * 0.0;
  auVar19._20_4_ = auVar81._20_4_ * 0.0;
  auVar19._24_4_ = auVar81._24_4_ * 0.0;
  auVar19._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 + uVar72 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar3));
  auVar20._4_4_ = auVar81._4_4_ * auVar278._4_4_;
  auVar20._0_4_ = auVar81._0_4_ * auVar278._0_4_;
  auVar20._8_4_ = auVar81._8_4_ * auVar278._8_4_;
  auVar20._12_4_ = auVar81._12_4_ * auVar278._12_4_;
  auVar20._16_4_ = auVar81._16_4_ * 0.0;
  auVar20._20_4_ = auVar81._20_4_ * 0.0;
  auVar20._24_4_ = auVar81._24_4_ * 0.0;
  auVar20._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar3));
  auVar261._4_4_ = auVar278._4_4_ * auVar81._4_4_;
  auVar261._0_4_ = auVar278._0_4_ * auVar81._0_4_;
  auVar261._8_4_ = auVar278._8_4_ * auVar81._8_4_;
  auVar261._12_4_ = auVar278._12_4_ * auVar81._12_4_;
  auVar261._16_4_ = auVar81._16_4_ * 0.0;
  auVar261._20_4_ = auVar81._20_4_ * 0.0;
  auVar261._24_4_ = auVar81._24_4_ * 0.0;
  auVar261._28_4_ = auVar81._28_4_;
  auVar81 = vpminsd_avx2(auVar16,auVar17);
  auVar15 = vpminsd_avx2(auVar18,auVar19);
  auVar81 = vmaxps_avx(auVar81,auVar15);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar202._4_4_ = uVar74;
  auVar202._0_4_ = uVar74;
  auVar202._8_4_ = uVar74;
  auVar202._12_4_ = uVar74;
  auVar202._16_4_ = uVar74;
  auVar202._20_4_ = uVar74;
  auVar202._24_4_ = uVar74;
  auVar202._28_4_ = uVar74;
  auVar15 = vpminsd_avx2(auVar20,auVar261);
  auVar15 = vmaxps_avx(auVar15,auVar202);
  auVar81 = vmaxps_avx(auVar81,auVar15);
  local_320._4_4_ = auVar81._4_4_ * 0.99999964;
  local_320._0_4_ = auVar81._0_4_ * 0.99999964;
  local_320._8_4_ = auVar81._8_4_ * 0.99999964;
  local_320._12_4_ = auVar81._12_4_ * 0.99999964;
  local_320._16_4_ = auVar81._16_4_ * 0.99999964;
  local_320._20_4_ = auVar81._20_4_ * 0.99999964;
  local_320._24_4_ = auVar81._24_4_ * 0.99999964;
  local_320._28_4_ = auVar15._28_4_;
  auVar81 = vpmaxsd_avx2(auVar16,auVar17);
  auVar15 = vpmaxsd_avx2(auVar18,auVar19);
  auVar81 = vminps_avx(auVar81,auVar15);
  auVar15 = vpmaxsd_avx2(auVar20,auVar261);
  uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar74;
  auVar113._0_4_ = uVar74;
  auVar113._8_4_ = uVar74;
  auVar113._12_4_ = uVar74;
  auVar113._16_4_ = uVar74;
  auVar113._20_4_ = uVar74;
  auVar113._24_4_ = uVar74;
  auVar113._28_4_ = uVar74;
  auVar15 = vminps_avx(auVar15,auVar113);
  auVar81 = vminps_avx(auVar81,auVar15);
  auVar24._4_4_ = auVar81._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar81._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar81._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar81._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar81._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar81._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar81._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar81._28_4_;
  auVar97[4] = PVar7;
  auVar97._5_3_ = 0;
  auVar97[8] = PVar7;
  auVar97._9_3_ = 0;
  auVar97[0xc] = PVar7;
  auVar97._13_3_ = 0;
  auVar97[0x10] = PVar7;
  auVar97._17_3_ = 0;
  auVar97[0x14] = PVar7;
  auVar97._21_3_ = 0;
  auVar97[0x18] = PVar7;
  auVar97._25_3_ = 0;
  auVar97[0x1c] = PVar7;
  auVar97._29_3_ = 0;
  auVar15 = vpcmpgtd_avx2(auVar97,_DAT_0205a920);
  auVar81 = vcmpps_avx(local_320,auVar24,2);
  auVar81 = vandps_avx(auVar81,auVar15);
  uVar62 = vmovmskps_avx(auVar81);
  if (uVar62 == 0) {
    return;
  }
  uVar62 = uVar62 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  iVar63 = 1 << ((uint)k & 0x1f);
  auVar82._4_4_ = iVar63;
  auVar82._0_4_ = iVar63;
  auVar82._8_4_ = iVar63;
  auVar82._12_4_ = iVar63;
  auVar82._16_4_ = iVar63;
  auVar82._20_4_ = iVar63;
  auVar82._24_4_ = iVar63;
  auVar82._28_4_ = iVar63;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar81 = vpand_avx2(auVar82,auVar15);
  local_380 = vpcmpeqd_avx2(auVar81,auVar15);
LAB_018623e4:
  lVar68 = 0;
  uVar72 = (ulong)uVar62;
  for (uVar66 = uVar72; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  uVar62 = *(uint *)(prim + 2);
  uVar8 = *(uint *)(prim + lVar68 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar62].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar8);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var12 + uVar66 * (long)pvVar11);
  auVar13 = *(undefined1 (*) [16])(_Var12 + (uVar66 + 1) * (long)pvVar11);
  auVar14 = *(undefined1 (*) [16])(_Var12 + (uVar66 + 2) * (long)pvVar11);
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar66 + 3));
  fVar73 = *pfVar1;
  fVar85 = pfVar1[1];
  fVar142 = pfVar1[2];
  fVar155 = pfVar1[3];
  lVar68 = *(long *)&pGVar9[1].time_range.upper;
  auVar278 = *(undefined1 (*) [16])(lVar68 + (long)p_Var10 * uVar66);
  auVar3 = *(undefined1 (*) [16])(lVar68 + (long)p_Var10 * (uVar66 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar68 + (long)p_Var10 * (uVar66 + 2));
  uVar72 = uVar72 - 1 & uVar72;
  pfVar1 = (float *)(lVar68 + (long)p_Var10 * (uVar66 + 3));
  fVar160 = *pfVar1;
  fVar180 = pfVar1[1];
  fVar183 = pfVar1[2];
  fVar185 = pfVar1[3];
  if (uVar72 != 0) {
    uVar71 = uVar72 - 1 & uVar72;
    for (uVar66 = uVar72; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    }
    if (uVar71 != 0) {
      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar86._0_4_ = fVar160 * 0.0;
  auVar86._4_4_ = fVar180 * 0.0;
  auVar86._8_4_ = fVar183 * 0.0;
  auVar86._12_4_ = fVar185 * 0.0;
  auVar275._8_4_ = 0x3e2aaaab;
  auVar275._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar275._12_4_ = 0x3e2aaaab;
  auVar221 = vfmadd213ps_fma(auVar275,auVar4,auVar86);
  auVar204._8_4_ = 0x3f2aaaab;
  auVar204._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar204._12_4_ = 0x3f2aaaab;
  auVar221 = vfmadd231ps_fma(auVar221,auVar3,auVar204);
  auVar108 = vfmadd231ps_fma(auVar221,auVar278,auVar275);
  auVar77._8_4_ = 0x3f000000;
  auVar77._0_8_ = 0x3f0000003f000000;
  auVar77._12_4_ = 0x3f000000;
  auVar221 = vfmadd231ps_fma(auVar86,auVar4,auVar77);
  auVar221 = vfnmadd231ps_fma(auVar221,auVar3,ZEXT816(0) << 0x40);
  auVar209 = vfnmadd231ps_fma(auVar221,auVar278,auVar77);
  auVar251._0_4_ = fVar73 * 0.0;
  auVar251._4_4_ = fVar85 * 0.0;
  auVar251._8_4_ = fVar142 * 0.0;
  auVar251._12_4_ = fVar155 * 0.0;
  auVar221 = vfmadd213ps_fma(auVar275,auVar14,auVar251);
  auVar221 = vfmadd231ps_fma(auVar221,auVar13,auVar204);
  auVar221 = vfmadd231ps_fma(auVar221,auVar5,auVar275);
  auVar76 = vfmadd231ps_fma(auVar251,auVar14,auVar77);
  auVar76 = vfnmadd231ps_fma(auVar76,auVar13,(undefined1  [16])0x0);
  auVar21 = vfnmadd231ps_fma(auVar76,auVar5,auVar77);
  auVar117._0_4_ = fVar160 * 0.16666667;
  auVar117._4_4_ = fVar180 * 0.16666667;
  auVar117._8_4_ = fVar183 * 0.16666667;
  auVar117._12_4_ = fVar185 * 0.16666667;
  auVar76 = vfmadd231ps_fma(auVar117,auVar4,auVar204);
  auVar76 = vfmadd231ps_fma(auVar76,auVar3,auVar275);
  auVar76 = vfmadd231ps_fma(auVar76,auVar278,(undefined1  [16])0x0);
  auVar129._0_4_ = fVar160 * 0.5;
  auVar129._4_4_ = fVar180 * 0.5;
  auVar129._8_4_ = fVar183 * 0.5;
  auVar129._12_4_ = fVar185 * 0.5;
  auVar4 = vfmadd231ps_fma(auVar129,(undefined1  [16])0x0,auVar4);
  auVar3 = vfnmadd231ps_fma(auVar4,auVar77,auVar3);
  auVar22 = vfnmadd231ps_fma(auVar3,(undefined1  [16])0x0,auVar278);
  auVar220._0_4_ = fVar73 * 0.16666667;
  auVar220._4_4_ = fVar85 * 0.16666667;
  auVar220._8_4_ = fVar142 * 0.16666667;
  auVar220._12_4_ = fVar155 * 0.16666667;
  auVar103._8_4_ = 0x3f2aaaab;
  auVar103._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar103._12_4_ = 0x3f2aaaab;
  auVar278 = vfmadd231ps_fma(auVar220,auVar14,auVar103);
  auVar278 = vfmadd231ps_fma(auVar278,auVar13,auVar275);
  auVar4 = vfmadd231ps_fma(auVar278,auVar5,(undefined1  [16])0x0);
  auVar231._0_4_ = fVar73 * 0.5;
  auVar231._4_4_ = fVar85 * 0.5;
  auVar231._8_4_ = fVar142 * 0.5;
  auVar231._12_4_ = fVar155 * 0.5;
  auVar14 = vfmadd231ps_fma(auVar231,(undefined1  [16])0x0,auVar14);
  auVar13 = vfnmadd231ps_fma(auVar14,auVar77,auVar13);
  auVar5 = vfnmadd231ps_fma(auVar13,(undefined1  [16])0x0,auVar5);
  auVar13 = vshufps_avx(auVar209,auVar209,0xc9);
  auVar14 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar156 = auVar209._0_4_;
  auVar162._0_4_ = fVar156 * auVar14._0_4_;
  fVar157 = auVar209._4_4_;
  auVar162._4_4_ = fVar157 * auVar14._4_4_;
  fVar101 = auVar209._8_4_;
  auVar162._8_4_ = fVar101 * auVar14._8_4_;
  fVar102 = auVar209._12_4_;
  auVar162._12_4_ = fVar102 * auVar14._12_4_;
  auVar14 = vfmsub231ps_fma(auVar162,auVar13,auVar221);
  auVar278 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar14 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar163._0_4_ = fVar156 * auVar14._0_4_;
  auVar163._4_4_ = fVar157 * auVar14._4_4_;
  auVar163._8_4_ = fVar101 * auVar14._8_4_;
  auVar163._12_4_ = fVar102 * auVar14._12_4_;
  auVar13 = vfmsub231ps_fma(auVar163,auVar13,auVar21);
  auVar3 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar14 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar75 = auVar22._0_4_;
  auVar143._0_4_ = fVar75 * auVar14._0_4_;
  fVar182 = auVar22._4_4_;
  auVar143._4_4_ = fVar182 * auVar14._4_4_;
  fVar158 = auVar22._8_4_;
  auVar143._8_4_ = fVar158 * auVar14._8_4_;
  fVar159 = auVar22._12_4_;
  auVar143._12_4_ = fVar159 * auVar14._12_4_;
  auVar14 = vfmsub231ps_fma(auVar143,auVar13,auVar4);
  auVar4 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar14 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar190._0_4_ = fVar75 * auVar14._0_4_;
  auVar190._4_4_ = fVar182 * auVar14._4_4_;
  auVar190._8_4_ = fVar158 * auVar14._8_4_;
  auVar190._12_4_ = fVar159 * auVar14._12_4_;
  auVar14 = vfmsub231ps_fma(auVar190,auVar13,auVar5);
  auVar13 = vdpps_avx(auVar278,auVar278,0x7f);
  auVar5 = vshufps_avx(auVar14,auVar14,0xc9);
  fVar85 = auVar13._0_4_;
  auVar221 = ZEXT416((uint)fVar85);
  auVar14 = vrsqrtss_avx(auVar221,auVar221);
  fVar73 = auVar14._0_4_;
  auVar14 = vdpps_avx(auVar278,auVar3,0x7f);
  fVar73 = fVar73 * 1.5 + fVar85 * -0.5 * fVar73 * fVar73 * fVar73;
  fVar160 = auVar278._0_4_ * fVar73;
  fVar180 = auVar278._4_4_ * fVar73;
  fVar183 = auVar278._8_4_ * fVar73;
  fVar185 = auVar278._12_4_ * fVar73;
  auVar243._0_4_ = auVar3._0_4_ * fVar85;
  auVar243._4_4_ = auVar3._4_4_ * fVar85;
  auVar243._8_4_ = auVar3._8_4_ * fVar85;
  auVar243._12_4_ = auVar3._12_4_ * fVar85;
  fVar85 = auVar14._0_4_;
  auVar205._0_4_ = auVar278._0_4_ * fVar85;
  auVar205._4_4_ = auVar278._4_4_ * fVar85;
  auVar205._8_4_ = auVar278._8_4_ * fVar85;
  auVar205._12_4_ = auVar278._12_4_ * fVar85;
  auVar278 = vsubps_avx(auVar243,auVar205);
  auVar14 = vrcpss_avx(auVar221,auVar221);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar14,SUB6416(ZEXT464(0x40000000),0));
  fVar142 = auVar14._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar155 = auVar13._0_4_;
  auVar221 = ZEXT416((uint)fVar155);
  auVar14 = vrsqrtss_avx(auVar221,auVar221);
  fVar85 = auVar14._0_4_;
  fVar85 = fVar85 * 1.5 + fVar155 * -0.5 * fVar85 * fVar85 * fVar85;
  fVar250 = fVar85 * auVar4._0_4_;
  fVar263 = fVar85 * auVar4._4_4_;
  fVar264 = fVar85 * auVar4._8_4_;
  fVar265 = fVar85 * auVar4._12_4_;
  auVar14 = vdpps_avx(auVar4,auVar5,0x7f);
  auVar191._0_4_ = fVar155 * auVar5._0_4_;
  auVar191._4_4_ = fVar155 * auVar5._4_4_;
  auVar191._8_4_ = fVar155 * auVar5._8_4_;
  auVar191._12_4_ = fVar155 * auVar5._12_4_;
  fVar155 = auVar14._0_4_;
  auVar144._0_4_ = fVar155 * auVar4._0_4_;
  auVar144._4_4_ = fVar155 * auVar4._4_4_;
  auVar144._8_4_ = fVar155 * auVar4._8_4_;
  auVar144._12_4_ = fVar155 * auVar4._12_4_;
  auVar3 = vsubps_avx(auVar191,auVar144);
  auVar14 = vrcpss_avx(auVar221,auVar221);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar14,SUB6416(ZEXT464(0x40000000),0));
  fVar155 = auVar13._0_4_ * auVar14._0_4_;
  auVar13 = vshufps_avx(auVar108,auVar108,0xff);
  auVar222._0_4_ = auVar13._0_4_ * fVar160;
  auVar222._4_4_ = auVar13._4_4_ * fVar180;
  auVar222._8_4_ = auVar13._8_4_ * fVar183;
  auVar222._12_4_ = auVar13._12_4_ * fVar185;
  local_5b0 = vsubps_avx(auVar108,auVar222);
  auVar14 = vshufps_avx(auVar209,auVar209,0xff);
  auVar164._0_4_ = auVar14._0_4_ * fVar160 + fVar73 * auVar278._0_4_ * fVar142 * auVar13._0_4_;
  auVar164._4_4_ = auVar14._4_4_ * fVar180 + fVar73 * auVar278._4_4_ * fVar142 * auVar13._4_4_;
  auVar164._8_4_ = auVar14._8_4_ * fVar183 + fVar73 * auVar278._8_4_ * fVar142 * auVar13._8_4_;
  auVar164._12_4_ = auVar14._12_4_ * fVar185 + fVar73 * auVar278._12_4_ * fVar142 * auVar13._12_4_;
  auVar278 = vsubps_avx(auVar209,auVar164);
  local_5c0._0_4_ = auVar108._0_4_ + auVar222._0_4_;
  local_5c0._4_4_ = auVar108._4_4_ + auVar222._4_4_;
  fStack_5b8 = auVar108._8_4_ + auVar222._8_4_;
  fStack_5b4 = auVar108._12_4_ + auVar222._12_4_;
  auVar13 = vshufps_avx(auVar76,auVar76,0xff);
  auVar104._0_4_ = fVar250 * auVar13._0_4_;
  auVar104._4_4_ = fVar263 * auVar13._4_4_;
  auVar104._8_4_ = fVar264 * auVar13._8_4_;
  auVar104._12_4_ = fVar265 * auVar13._12_4_;
  local_5d0 = vsubps_avx(auVar76,auVar104);
  auVar14 = vshufps_avx(auVar22,auVar22,0xff);
  auVar87._0_4_ = fVar250 * auVar14._0_4_ + auVar13._0_4_ * fVar85 * auVar3._0_4_ * fVar155;
  auVar87._4_4_ = fVar263 * auVar14._4_4_ + auVar13._4_4_ * fVar85 * auVar3._4_4_ * fVar155;
  auVar87._8_4_ = fVar264 * auVar14._8_4_ + auVar13._8_4_ * fVar85 * auVar3._8_4_ * fVar155;
  auVar87._12_4_ = fVar265 * auVar14._12_4_ + auVar13._12_4_ * fVar85 * auVar3._12_4_ * fVar155;
  auVar13 = vsubps_avx(auVar22,auVar87);
  fVar160 = auVar76._0_4_ + auVar104._0_4_;
  fVar180 = auVar76._4_4_ + auVar104._4_4_;
  fVar183 = auVar76._8_4_ + auVar104._8_4_;
  fVar185 = auVar76._12_4_ + auVar104._12_4_;
  local_5e0._0_4_ = local_5b0._0_4_ + auVar278._0_4_ * 0.33333334;
  local_5e0._4_4_ = local_5b0._4_4_ + auVar278._4_4_ * 0.33333334;
  local_5e0._8_4_ = local_5b0._8_4_ + auVar278._8_4_ * 0.33333334;
  local_5e0._12_4_ = local_5b0._12_4_ + auVar278._12_4_ * 0.33333334;
  auVar88._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar88._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar88._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar88._12_4_ = auVar13._12_4_ * 0.33333334;
  local_5f0 = vsubps_avx(local_5d0,auVar88);
  local_590 = vsubps_avx(local_5b0,auVar6);
  auVar13 = vshufps_avx(local_590,local_590,0x55);
  auVar14 = vshufps_avx(local_590,local_590,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar73 = pre->ray_space[k].vz.field_0.m128[0];
  fVar85 = pre->ray_space[k].vz.field_0.m128[1];
  fVar142 = pre->ray_space[k].vz.field_0.m128[2];
  fVar155 = pre->ray_space[k].vz.field_0.m128[3];
  auVar89._0_4_ = fVar73 * auVar14._0_4_;
  auVar89._4_4_ = fVar85 * auVar14._4_4_;
  auVar89._8_4_ = fVar142 * auVar14._8_4_;
  auVar89._12_4_ = fVar155 * auVar14._12_4_;
  auVar278 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar2,auVar13);
  local_5a0 = vsubps_avx(local_5e0,auVar6);
  auVar13 = vshufps_avx(local_5a0,local_5a0,0x55);
  auVar14 = vshufps_avx(local_5a0,local_5a0,0xaa);
  auVar285._0_4_ = fVar73 * auVar14._0_4_;
  auVar285._4_4_ = fVar85 * auVar14._4_4_;
  auVar285._8_4_ = fVar142 * auVar14._8_4_;
  auVar285._12_4_ = fVar155 * auVar14._12_4_;
  auVar14 = vfmadd231ps_fma(auVar285,(undefined1  [16])aVar2,auVar13);
  local_400 = vsubps_avx(local_5f0,auVar6);
  auVar13 = vshufps_avx(local_400,local_400,0xaa);
  auVar252._0_4_ = fVar73 * auVar13._0_4_;
  auVar252._4_4_ = fVar85 * auVar13._4_4_;
  auVar252._8_4_ = fVar142 * auVar13._8_4_;
  auVar252._12_4_ = fVar155 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_400,local_400,0x55);
  auVar3 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar2,auVar13);
  local_410 = vsubps_avx(local_5d0,auVar6);
  auVar13 = vshufps_avx(local_410,local_410,0xaa);
  auVar276._0_4_ = fVar73 * auVar13._0_4_;
  auVar276._4_4_ = fVar85 * auVar13._4_4_;
  auVar276._8_4_ = fVar142 * auVar13._8_4_;
  auVar276._12_4_ = fVar155 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_410,local_410,0x55);
  auVar4 = vfmadd231ps_fma(auVar276,(undefined1  [16])aVar2,auVar13);
  local_420 = vsubps_avx(_local_5c0,auVar6);
  auVar13 = vshufps_avx(local_420,local_420,0xaa);
  auVar145._0_4_ = fVar73 * auVar13._0_4_;
  auVar145._4_4_ = fVar85 * auVar13._4_4_;
  auVar145._8_4_ = fVar142 * auVar13._8_4_;
  auVar145._12_4_ = fVar155 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_420,local_420,0x55);
  auVar5 = vfmadd231ps_fma(auVar145,(undefined1  [16])aVar2,auVar13);
  local_600._0_4_ = (fVar156 + auVar164._0_4_) * 0.33333334 + (float)local_5c0._0_4_;
  local_600._4_4_ = (fVar157 + auVar164._4_4_) * 0.33333334 + (float)local_5c0._4_4_;
  fStack_5f8 = (fVar101 + auVar164._8_4_) * 0.33333334 + fStack_5b8;
  fStack_5f4 = (fVar102 + auVar164._12_4_) * 0.33333334 + fStack_5b4;
  local_430 = vsubps_avx(_local_600,auVar6);
  auVar13 = vshufps_avx(local_430,local_430,0xaa);
  auVar206._0_4_ = auVar13._0_4_ * fVar73;
  auVar206._4_4_ = auVar13._4_4_ * fVar85;
  auVar206._8_4_ = auVar13._8_4_ * fVar142;
  auVar206._12_4_ = auVar13._12_4_ * fVar155;
  auVar13 = vshufps_avx(local_430,local_430,0x55);
  auVar221 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar2,auVar13);
  auVar223._0_4_ = (fVar75 + auVar87._0_4_) * 0.33333334;
  auVar223._4_4_ = (fVar182 + auVar87._4_4_) * 0.33333334;
  auVar223._8_4_ = (fVar158 + auVar87._8_4_) * 0.33333334;
  auVar223._12_4_ = (fVar159 + auVar87._12_4_) * 0.33333334;
  auVar21._4_4_ = fVar180;
  auVar21._0_4_ = fVar160;
  auVar21._8_4_ = fVar183;
  auVar21._12_4_ = fVar185;
  _local_610 = vsubps_avx(auVar21,auVar223);
  local_440 = vsubps_avx(_local_610,auVar6);
  auVar13 = vshufps_avx(local_440,local_440,0xaa);
  auVar224._0_4_ = auVar13._0_4_ * fVar73;
  auVar224._4_4_ = auVar13._4_4_ * fVar85;
  auVar224._8_4_ = auVar13._8_4_ * fVar142;
  auVar224._12_4_ = auVar13._12_4_ * fVar155;
  auVar13 = vshufps_avx(local_440,local_440,0x55);
  auVar108 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar2,auVar13);
  local_450 = vsubps_avx(auVar21,auVar6);
  auVar13 = vshufps_avx(local_450,local_450,0xaa);
  auVar78._0_4_ = fVar73 * auVar13._0_4_;
  auVar78._4_4_ = fVar85 * auVar13._4_4_;
  auVar78._8_4_ = fVar142 * auVar13._8_4_;
  auVar78._12_4_ = fVar155 * auVar13._12_4_;
  auVar13 = vshufps_avx(local_450,local_450,0x55);
  auVar13 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar13);
  auVar165._4_4_ = local_590._0_4_;
  auVar165._0_4_ = local_590._0_4_;
  auVar165._8_4_ = local_590._0_4_;
  auVar165._12_4_ = local_590._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar6 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar2,auVar165);
  auVar166._4_4_ = local_5a0._0_4_;
  auVar166._0_4_ = local_5a0._0_4_;
  auVar166._8_4_ = local_5a0._0_4_;
  auVar166._12_4_ = local_5a0._0_4_;
  auVar76 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar166);
  uVar74 = local_400._0_4_;
  auVar167._4_4_ = uVar74;
  auVar167._0_4_ = uVar74;
  auVar167._8_4_ = uVar74;
  auVar167._12_4_ = uVar74;
  auVar209 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar167);
  uVar74 = local_410._0_4_;
  auVar168._4_4_ = uVar74;
  auVar168._0_4_ = uVar74;
  auVar168._8_4_ = uVar74;
  auVar168._12_4_ = uVar74;
  auVar21 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar168);
  uVar74 = local_420._0_4_;
  auVar169._4_4_ = uVar74;
  auVar169._0_4_ = uVar74;
  auVar169._8_4_ = uVar74;
  auVar169._12_4_ = uVar74;
  auVar22 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar169);
  uVar74 = local_430._0_4_;
  auVar170._4_4_ = uVar74;
  auVar170._0_4_ = uVar74;
  auVar170._8_4_ = uVar74;
  auVar170._12_4_ = uVar74;
  auVar221 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar2,auVar170);
  uVar74 = local_440._0_4_;
  auVar171._4_4_ = uVar74;
  auVar171._0_4_ = uVar74;
  auVar171._8_4_ = uVar74;
  auVar171._12_4_ = uVar74;
  auVar108 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar2,auVar171);
  uVar74 = local_450._0_4_;
  auVar172._4_4_ = uVar74;
  auVar172._0_4_ = uVar74;
  auVar172._8_4_ = uVar74;
  auVar172._12_4_ = uVar74;
  auVar77 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar172);
  auVar3 = vmovlhps_avx(auVar6,auVar22);
  auVar4 = vmovlhps_avx(auVar76,auVar221);
  local_500 = vmovlhps_avx(auVar209,auVar108);
  auVar5 = vmovlhps_avx(auVar21,auVar77);
  auVar13 = vminps_avx(auVar3,auVar4);
  auVar14 = vminps_avx(local_500,auVar5);
  auVar278 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar3,auVar4);
  auVar14 = vmaxps_avx(local_500,auVar5);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar14 = vshufpd_avx(auVar278,auVar278,3);
  auVar278 = vminps_avx(auVar278,auVar14);
  auVar14 = vshufpd_avx(auVar13,auVar13,3);
  auVar14 = vmaxps_avx(auVar13,auVar14);
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar132,auVar278);
  auVar14 = vandps_avx(auVar132,auVar14);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar14 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar14,auVar13);
  fVar85 = auVar13._0_4_ * 9.536743e-07;
  local_510._8_8_ = auVar6._0_8_;
  local_510._0_8_ = auVar6._0_8_;
  local_520._8_8_ = auVar76._0_8_;
  local_520._0_8_ = auVar76._0_8_;
  local_530._0_8_ = auVar209._0_8_;
  local_530._8_8_ = local_530._0_8_;
  local_540._8_8_ = auVar21._0_8_;
  local_540._0_8_ = auVar21._0_8_;
  local_550 = auVar22._0_8_;
  register0x00001348 = local_550;
  register0x000013c8 = auVar221._0_8_;
  local_560 = auVar221._0_8_;
  register0x00001408 = auVar108._0_8_;
  local_570 = auVar108._0_8_;
  register0x00001448 = auVar77._0_8_;
  local_580 = auVar77._0_8_;
  local_2e0 = fVar85;
  fStack_2dc = fVar85;
  fStack_2d8 = fVar85;
  fStack_2d4 = fVar85;
  fStack_2d0 = fVar85;
  fStack_2cc = fVar85;
  fStack_2c8 = fVar85;
  fStack_2c4 = fVar85;
  local_300 = -fVar85;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_340 = uVar62;
  uStack_33c = uVar62;
  uStack_338 = uVar62;
  uStack_334 = uVar62;
  uStack_330 = uVar62;
  uStack_32c = uVar62;
  uStack_328 = uVar62;
  uStack_324 = uVar62;
  local_360 = uVar8;
  uStack_35c = uVar8;
  uStack_358 = uVar8;
  uStack_354 = uVar8;
  uStack_350 = uVar8;
  uStack_34c = uVar8;
  uStack_348 = uVar8;
  uStack_344 = uVar8;
  uVar66 = 0;
  fVar73 = *(float *)(ray + k * 4 + 0x60);
  local_3d0 = vsubps_avx(auVar4,auVar3);
  local_3e0 = vsubps_avx(local_500,auVar4);
  local_3f0 = vsubps_avx(auVar5,local_500);
  local_470 = vsubps_avx(_local_5c0,local_5b0);
  local_480 = vsubps_avx(_local_600,local_5e0);
  local_490 = vsubps_avx(_local_610,local_5f0);
  auVar22._4_4_ = fVar180;
  auVar22._0_4_ = fVar160;
  auVar22._8_4_ = fVar183;
  auVar22._12_4_ = fVar185;
  _local_4a0 = vsubps_avx(auVar22,local_5d0);
  local_780 = ZEXT816(0x3f80000000000000);
  local_460 = local_780;
  do {
    auVar13 = vshufps_avx(local_780,local_780,0x50);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = &DAT_3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar126._16_4_ = 0x3f800000;
    auVar126._0_16_ = auVar118;
    auVar126._20_4_ = 0x3f800000;
    auVar126._24_4_ = 0x3f800000;
    auVar126._28_4_ = 0x3f800000;
    auVar14 = vsubps_avx(auVar118,auVar13);
    fVar142 = auVar13._0_4_;
    auVar79._0_4_ = local_550._0_4_ * fVar142;
    fVar155 = auVar13._4_4_;
    auVar79._4_4_ = local_550._4_4_ * fVar155;
    fVar156 = auVar13._8_4_;
    auVar79._8_4_ = local_550._8_4_ * fVar156;
    fVar157 = auVar13._12_4_;
    auVar79._12_4_ = local_550._12_4_ * fVar157;
    auVar146._0_4_ = local_560._0_4_ * fVar142;
    auVar146._4_4_ = local_560._4_4_ * fVar155;
    auVar146._8_4_ = local_560._8_4_ * fVar156;
    auVar146._12_4_ = local_560._12_4_ * fVar157;
    auVar192._0_4_ = local_570._0_4_ * fVar142;
    auVar192._4_4_ = local_570._4_4_ * fVar155;
    auVar192._8_4_ = local_570._8_4_ * fVar156;
    auVar192._12_4_ = local_570._12_4_ * fVar157;
    auVar277._0_4_ = local_580._0_4_ * fVar142;
    auVar277._4_4_ = local_580._4_4_ * fVar155;
    auVar277._8_4_ = local_580._8_4_ * fVar156;
    auVar277._12_4_ = local_580._12_4_ * fVar157;
    auVar221 = vfmadd231ps_fma(auVar79,auVar14,local_510);
    auVar108 = vfmadd231ps_fma(auVar146,auVar14,local_520);
    auVar76 = vfmadd231ps_fma(auVar192,auVar14,local_530);
    auVar209 = vfmadd231ps_fma(auVar277,local_540,auVar14);
    local_6e0 = auVar209._0_4_;
    auVar13 = vmovshdup_avx(local_460);
    fVar142 = local_460._0_4_;
    fVar101 = (auVar13._0_4_ - fVar142) * 0.04761905;
    auVar219._4_4_ = fVar142;
    auVar219._0_4_ = fVar142;
    auVar219._8_4_ = fVar142;
    auVar219._12_4_ = fVar142;
    auVar219._16_4_ = fVar142;
    auVar219._20_4_ = fVar142;
    auVar219._24_4_ = fVar142;
    auVar219._28_4_ = fVar142;
    auVar114._0_8_ = auVar13._0_8_;
    auVar114._8_8_ = auVar114._0_8_;
    auVar114._16_8_ = auVar114._0_8_;
    auVar114._24_8_ = auVar114._0_8_;
    auVar81 = vsubps_avx(auVar114,auVar219);
    uVar74 = auVar221._0_4_;
    auVar291._4_4_ = uVar74;
    auVar291._0_4_ = uVar74;
    auVar291._8_4_ = uVar74;
    auVar291._12_4_ = uVar74;
    auVar291._16_4_ = uVar74;
    auVar291._20_4_ = uVar74;
    auVar291._24_4_ = uVar74;
    auVar291._28_4_ = uVar74;
    auVar13 = vmovshdup_avx(auVar221);
    uVar161 = auVar13._0_8_;
    auVar273._8_8_ = uVar161;
    auVar273._0_8_ = uVar161;
    auVar273._16_8_ = uVar161;
    auVar273._24_8_ = uVar161;
    fVar102 = auVar108._0_4_;
    auVar98._4_4_ = fVar102;
    auVar98._0_4_ = fVar102;
    auVar98._8_4_ = fVar102;
    auVar98._12_4_ = fVar102;
    auVar98._16_4_ = fVar102;
    auVar98._20_4_ = fVar102;
    auVar98._24_4_ = fVar102;
    auVar98._28_4_ = fVar102;
    auVar14 = vmovshdup_avx(auVar108);
    auVar177._0_8_ = auVar14._0_8_;
    auVar177._8_8_ = auVar177._0_8_;
    auVar177._16_8_ = auVar177._0_8_;
    auVar177._24_8_ = auVar177._0_8_;
    fVar158 = auVar76._0_4_;
    auVar249._4_4_ = fVar158;
    auVar249._0_4_ = fVar158;
    auVar249._8_4_ = fVar158;
    auVar249._12_4_ = fVar158;
    auVar249._16_4_ = fVar158;
    auVar249._20_4_ = fVar158;
    auVar249._24_4_ = fVar158;
    auVar249._28_4_ = fVar158;
    auVar278 = vmovshdup_avx(auVar76);
    auVar230._0_8_ = auVar278._0_8_;
    auVar230._8_8_ = auVar230._0_8_;
    auVar230._16_8_ = auVar230._0_8_;
    auVar230._24_8_ = auVar230._0_8_;
    auVar6 = vmovshdup_avx(auVar209);
    auVar21 = vfmadd132ps_fma(auVar81,auVar219,_DAT_02020f20);
    auVar81 = vsubps_avx(auVar126,ZEXT1632(auVar21));
    fVar142 = auVar21._0_4_;
    auVar282._0_4_ = fVar102 * fVar142;
    fVar155 = auVar21._4_4_;
    auVar282._4_4_ = fVar102 * fVar155;
    fVar156 = auVar21._8_4_;
    auVar282._8_4_ = fVar102 * fVar156;
    fVar157 = auVar21._12_4_;
    auVar282._12_4_ = fVar102 * fVar157;
    auVar282._16_4_ = fVar102 * 0.0;
    auVar282._20_4_ = fVar102 * 0.0;
    auVar282._24_4_ = fVar102 * 0.0;
    auVar282._28_4_ = 0;
    auVar21 = vfmadd231ps_fma(auVar282,auVar81,auVar291);
    fVar75 = auVar14._0_4_;
    auVar259._0_4_ = fVar75 * fVar142;
    fVar182 = auVar14._4_4_;
    auVar259._4_4_ = fVar182 * fVar155;
    auVar259._8_4_ = fVar75 * fVar156;
    auVar259._12_4_ = fVar182 * fVar157;
    auVar259._16_4_ = fVar75 * 0.0;
    auVar259._20_4_ = fVar182 * 0.0;
    auVar259._24_4_ = fVar75 * 0.0;
    auVar259._28_4_ = 0;
    auVar22 = vfmadd231ps_fma(auVar259,auVar81,auVar273);
    auVar15._4_4_ = fVar158 * fVar155;
    auVar15._0_4_ = fVar158 * fVar142;
    auVar15._8_4_ = fVar158 * fVar156;
    auVar15._12_4_ = fVar158 * fVar157;
    auVar15._16_4_ = fVar158 * 0.0;
    auVar15._20_4_ = fVar158 * 0.0;
    auVar15._24_4_ = fVar158 * 0.0;
    auVar15._28_4_ = auVar13._4_4_;
    auVar77 = vfmadd231ps_fma(auVar15,auVar81,auVar98);
    fVar75 = auVar278._0_4_;
    fVar182 = auVar278._4_4_;
    auVar25._4_4_ = fVar182 * fVar155;
    auVar25._0_4_ = fVar75 * fVar142;
    auVar25._8_4_ = fVar75 * fVar156;
    auVar25._12_4_ = fVar182 * fVar157;
    auVar25._16_4_ = fVar75 * 0.0;
    auVar25._20_4_ = fVar182 * 0.0;
    auVar25._24_4_ = fVar75 * 0.0;
    auVar25._28_4_ = uVar74;
    auVar132 = vfmadd231ps_fma(auVar25,auVar81,auVar177);
    auVar13 = vshufps_avx(auVar221,auVar221,0xaa);
    auVar178._0_8_ = auVar13._0_8_;
    auVar178._8_8_ = auVar178._0_8_;
    auVar178._16_8_ = auVar178._0_8_;
    auVar178._24_8_ = auVar178._0_8_;
    auVar14 = vshufps_avx(auVar221,auVar221,0xff);
    uStack_718 = auVar14._0_8_;
    local_720 = (undefined1  [8])uStack_718;
    uStack_710 = uStack_718;
    uStack_708 = uStack_718;
    auVar26._4_4_ = fVar155 * local_6e0;
    auVar26._0_4_ = fVar142 * local_6e0;
    auVar26._8_4_ = fVar156 * local_6e0;
    auVar26._12_4_ = fVar157 * local_6e0;
    auVar26._16_4_ = local_6e0 * 0.0;
    auVar26._20_4_ = local_6e0 * 0.0;
    auVar26._24_4_ = local_6e0 * 0.0;
    auVar26._28_4_ = 0x3f800000;
    auVar78 = vfmadd231ps_fma(auVar26,auVar81,auVar249);
    auVar278 = vshufps_avx(auVar108,auVar108,0xaa);
    auVar140._0_8_ = auVar278._0_8_;
    auVar140._8_8_ = auVar140._0_8_;
    auVar140._16_8_ = auVar140._0_8_;
    auVar140._24_8_ = auVar140._0_8_;
    auVar221 = vshufps_avx(auVar108,auVar108,0xff);
    auVar154._0_8_ = auVar221._0_8_;
    auVar154._8_8_ = auVar154._0_8_;
    auVar154._16_8_ = auVar154._0_8_;
    auVar154._24_8_ = auVar154._0_8_;
    fVar75 = auVar6._0_4_;
    fVar182 = auVar6._4_4_;
    auVar27._4_4_ = fVar182 * fVar155;
    auVar27._0_4_ = fVar75 * fVar142;
    auVar27._8_4_ = fVar75 * fVar156;
    auVar27._12_4_ = fVar182 * fVar157;
    auVar27._16_4_ = fVar75 * 0.0;
    auVar27._20_4_ = fVar182 * 0.0;
    auVar27._24_4_ = fVar75 * 0.0;
    auVar27._28_4_ = fVar158;
    auVar86 = vfmadd231ps_fma(auVar27,auVar81,auVar230);
    auVar28._28_4_ = fVar102;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar77._12_4_ * fVar157,
                            CONCAT48(auVar77._8_4_ * fVar156,
                                     CONCAT44(auVar77._4_4_ * fVar155,auVar77._0_4_ * fVar142))));
    auVar21 = vfmadd231ps_fma(auVar28,auVar81,ZEXT1632(auVar21));
    auVar29._28_4_ = auVar14._4_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar132._12_4_ * fVar157,
                            CONCAT48(auVar132._8_4_ * fVar156,
                                     CONCAT44(auVar132._4_4_ * fVar155,auVar132._0_4_ * fVar142))));
    auVar22 = vfmadd231ps_fma(auVar29,auVar81,ZEXT1632(auVar22));
    auVar14 = vshufps_avx(auVar76,auVar76,0xaa);
    uVar161 = auVar14._0_8_;
    auVar260._8_8_ = uVar161;
    auVar260._0_8_ = uVar161;
    auVar260._16_8_ = uVar161;
    auVar260._24_8_ = uVar161;
    auVar6 = vshufps_avx(auVar76,auVar76,0xff);
    uVar161 = auVar6._0_8_;
    auVar283._8_8_ = uVar161;
    auVar283._0_8_ = uVar161;
    auVar283._16_8_ = uVar161;
    auVar283._24_8_ = uVar161;
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar78._12_4_,
                                                 CONCAT48(fVar156 * auVar78._8_4_,
                                                          CONCAT44(fVar155 * auVar78._4_4_,
                                                                   fVar142 * auVar78._0_4_)))),
                              auVar81,ZEXT1632(auVar77));
    auVar108 = vshufps_avx(auVar209,auVar209,0xaa);
    auVar76 = vshufps_avx(auVar209,auVar209,0xff);
    local_6e0 = auVar76._0_4_;
    fStack_6dc = auVar76._4_4_;
    auVar30._28_4_ = fStack_6dc;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar86._12_4_ * fVar157,
                            CONCAT48(auVar86._8_4_ * fVar156,
                                     CONCAT44(auVar86._4_4_ * fVar155,auVar86._0_4_ * fVar142))));
    auVar76 = vfmadd231ps_fma(auVar30,auVar81,ZEXT1632(auVar132));
    auVar209 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar77._12_4_,
                                                  CONCAT48(fVar156 * auVar77._8_4_,
                                                           CONCAT44(fVar155 * auVar77._4_4_,
                                                                    fVar142 * auVar77._0_4_)))),
                               auVar81,ZEXT1632(auVar21));
    auVar15 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar21));
    auVar21 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar76._12_4_,
                                                 CONCAT48(fVar156 * auVar76._8_4_,
                                                          CONCAT44(fVar155 * auVar76._4_4_,
                                                                   fVar142 * auVar76._0_4_)))),
                              auVar81,ZEXT1632(auVar22));
    auVar83 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar22));
    fVar263 = fVar101 * auVar15._0_4_ * 3.0;
    fVar265 = fVar101 * auVar15._4_4_ * 3.0;
    auVar31._4_4_ = fVar265;
    auVar31._0_4_ = fVar263;
    fVar238 = fVar101 * auVar15._8_4_ * 3.0;
    auVar31._8_4_ = fVar238;
    fVar239 = fVar101 * auVar15._12_4_ * 3.0;
    auVar31._12_4_ = fVar239;
    fVar240 = fVar101 * auVar15._16_4_ * 3.0;
    auVar31._16_4_ = fVar240;
    fVar241 = fVar101 * auVar15._20_4_ * 3.0;
    auVar31._20_4_ = fVar241;
    fVar242 = fVar101 * auVar15._24_4_ * 3.0;
    auVar31._24_4_ = fVar242;
    auVar31._28_4_ = 0x40400000;
    local_740._0_4_ = fVar101 * auVar83._0_4_ * 3.0;
    local_740._4_4_ = fVar101 * auVar83._4_4_ * 3.0;
    fStack_738 = fVar101 * auVar83._8_4_ * 3.0;
    fStack_734 = fVar101 * auVar83._12_4_ * 3.0;
    fStack_730 = fVar101 * auVar83._16_4_ * 3.0;
    fStack_72c = fVar101 * auVar83._20_4_ * 3.0;
    fStack_728 = fVar101 * auVar83._24_4_ * 3.0;
    fStack_724 = auVar83._28_4_;
    fVar102 = auVar278._0_4_;
    fVar75 = auVar278._4_4_;
    auVar32._4_4_ = fVar75 * fVar155;
    auVar32._0_4_ = fVar102 * fVar142;
    auVar32._8_4_ = fVar102 * fVar156;
    auVar32._12_4_ = fVar75 * fVar157;
    auVar32._16_4_ = fVar102 * 0.0;
    auVar32._20_4_ = fVar75 * 0.0;
    auVar32._24_4_ = fVar102 * 0.0;
    auVar32._28_4_ = auVar15._28_4_;
    auVar278 = vfmadd231ps_fma(auVar32,auVar81,auVar178);
    fVar102 = auVar221._0_4_;
    fVar182 = auVar221._4_4_;
    auVar33._4_4_ = fVar182 * fVar155;
    auVar33._0_4_ = fVar102 * fVar142;
    auVar33._8_4_ = fVar102 * fVar156;
    auVar33._12_4_ = fVar182 * fVar157;
    auVar33._16_4_ = fVar102 * 0.0;
    auVar33._20_4_ = fVar182 * 0.0;
    auVar33._24_4_ = fVar102 * 0.0;
    auVar33._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar33,auVar81,_local_720);
    fVar102 = auVar14._0_4_;
    fVar182 = auVar14._4_4_;
    auVar34._4_4_ = fVar182 * fVar155;
    auVar34._0_4_ = fVar102 * fVar142;
    auVar34._8_4_ = fVar102 * fVar156;
    auVar34._12_4_ = fVar182 * fVar157;
    auVar34._16_4_ = fVar102 * 0.0;
    auVar34._20_4_ = fVar182 * 0.0;
    auVar34._24_4_ = fVar102 * 0.0;
    auVar34._28_4_ = fVar101;
    auVar14 = vfmadd231ps_fma(auVar34,auVar81,auVar140);
    fVar102 = auVar6._0_4_;
    fVar158 = auVar6._4_4_;
    auVar35._4_4_ = fVar158 * fVar155;
    auVar35._0_4_ = fVar102 * fVar142;
    auVar35._8_4_ = fVar102 * fVar156;
    auVar35._12_4_ = fVar158 * fVar157;
    auVar35._16_4_ = fVar102 * 0.0;
    auVar35._20_4_ = fVar158 * 0.0;
    auVar35._24_4_ = fVar102 * 0.0;
    auVar35._28_4_ = fVar75;
    auVar6 = vfmadd231ps_fma(auVar35,auVar81,auVar154);
    local_4e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar209));
    fVar102 = auVar108._0_4_;
    fVar75 = auVar108._4_4_;
    auVar36._4_4_ = fVar75 * fVar155;
    auVar36._0_4_ = fVar102 * fVar142;
    auVar36._8_4_ = fVar102 * fVar156;
    auVar36._12_4_ = fVar75 * fVar157;
    auVar36._16_4_ = fVar102 * 0.0;
    auVar36._20_4_ = fVar75 * 0.0;
    auVar36._24_4_ = fVar102 * 0.0;
    auVar36._28_4_ = local_4e0._28_4_;
    auVar221 = vfmadd231ps_fma(auVar36,auVar81,auVar260);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar21));
    auVar37._4_4_ = fVar155 * fStack_6dc;
    auVar37._0_4_ = fVar142 * local_6e0;
    auVar37._8_4_ = fVar156 * local_6e0;
    auVar37._12_4_ = fVar157 * fStack_6dc;
    auVar37._16_4_ = local_6e0 * 0.0;
    auVar37._20_4_ = fStack_6dc * 0.0;
    auVar37._24_4_ = local_6e0 * 0.0;
    auVar37._28_4_ = fVar182;
    auVar108 = vfmadd231ps_fma(auVar37,auVar81,auVar283);
    auVar38._28_4_ = fVar75;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar157 * auVar14._12_4_,
                            CONCAT48(fVar156 * auVar14._8_4_,
                                     CONCAT44(fVar155 * auVar14._4_4_,fVar142 * auVar14._0_4_))));
    auVar278 = vfmadd231ps_fma(auVar38,auVar81,ZEXT1632(auVar278));
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar6._12_4_,
                                                 CONCAT48(fVar156 * auVar6._8_4_,
                                                          CONCAT44(fVar155 * auVar6._4_4_,
                                                                   fVar142 * auVar6._0_4_)))),
                              auVar81,ZEXT1632(auVar13));
    fVar263 = auVar209._0_4_ + fVar263;
    fVar265 = auVar209._4_4_ + fVar265;
    fVar238 = auVar209._8_4_ + fVar238;
    fVar239 = auVar209._12_4_ + fVar239;
    fVar240 = fVar240 + 0.0;
    fVar241 = fVar241 + 0.0;
    fVar242 = fVar242 + 0.0;
    auVar39._28_4_ = 0x40400000;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(auVar108._12_4_ * fVar157,
                            CONCAT48(auVar108._8_4_ * fVar156,
                                     CONCAT44(auVar108._4_4_ * fVar155,auVar108._0_4_ * fVar142))));
    auVar14 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar221._12_4_,
                                                 CONCAT48(fVar156 * auVar221._8_4_,
                                                          CONCAT44(fVar155 * auVar221._4_4_,
                                                                   fVar142 * auVar221._0_4_)))),
                              auVar81,ZEXT1632(auVar14));
    auVar6 = vfmadd231ps_fma(auVar39,auVar81,ZEXT1632(auVar6));
    auVar221 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar14._12_4_,
                                                  CONCAT48(fVar156 * auVar14._8_4_,
                                                           CONCAT44(fVar155 * auVar14._4_4_,
                                                                    fVar142 * auVar14._0_4_)))),
                               auVar81,ZEXT1632(auVar278));
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar157 * auVar6._12_4_,
                                                  CONCAT48(fVar156 * auVar6._8_4_,
                                                           CONCAT44(fVar155 * auVar6._4_4_,
                                                                    fVar142 * auVar6._0_4_)))),
                               ZEXT1632(auVar13),auVar81);
    auVar81 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar278));
    auVar15 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar13));
    fVar142 = fVar101 * auVar81._0_4_ * 3.0;
    fVar155 = fVar101 * auVar81._4_4_ * 3.0;
    auVar40._4_4_ = fVar155;
    auVar40._0_4_ = fVar142;
    fVar156 = fVar101 * auVar81._8_4_ * 3.0;
    auVar40._8_4_ = fVar156;
    fVar157 = fVar101 * auVar81._12_4_ * 3.0;
    auVar40._12_4_ = fVar157;
    fVar158 = fVar101 * auVar81._16_4_ * 3.0;
    auVar40._16_4_ = fVar158;
    fVar159 = fVar101 * auVar81._20_4_ * 3.0;
    auVar40._20_4_ = fVar159;
    fVar250 = fVar101 * auVar81._24_4_ * 3.0;
    auVar40._24_4_ = fVar250;
    auVar40._28_4_ = 0x40400000;
    auVar203._0_4_ = fVar101 * auVar15._0_4_ * 3.0;
    auVar203._4_4_ = fVar101 * auVar15._4_4_ * 3.0;
    auVar203._8_4_ = fVar101 * auVar15._8_4_ * 3.0;
    auVar203._12_4_ = fVar101 * auVar15._12_4_ * 3.0;
    auVar203._16_4_ = fVar101 * auVar15._16_4_ * 3.0;
    auVar203._20_4_ = fVar101 * auVar15._20_4_ * 3.0;
    auVar203._24_4_ = fVar101 * auVar15._24_4_ * 3.0;
    auVar203._28_4_ = 0;
    auVar19 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar221));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar108));
    auVar81 = vsubps_avx(ZEXT1632(auVar221),ZEXT1632(auVar209));
    auVar15 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar21));
    auVar16 = vsubps_avx(auVar19,local_4e0);
    fVar264 = auVar81._0_4_ + auVar16._0_4_;
    fVar181 = auVar81._4_4_ + auVar16._4_4_;
    fVar184 = auVar81._8_4_ + auVar16._8_4_;
    fVar186 = auVar81._12_4_ + auVar16._12_4_;
    fVar187 = auVar81._16_4_ + auVar16._16_4_;
    fVar188 = auVar81._20_4_ + auVar16._20_4_;
    fVar189 = auVar81._24_4_ + auVar16._24_4_;
    auVar17 = vsubps_avx(local_1c0,auVar18);
    auVar274._0_4_ = auVar15._0_4_ + auVar17._0_4_;
    auVar274._4_4_ = auVar15._4_4_ + auVar17._4_4_;
    auVar274._8_4_ = auVar15._8_4_ + auVar17._8_4_;
    auVar274._12_4_ = auVar15._12_4_ + auVar17._12_4_;
    auVar274._16_4_ = auVar15._16_4_ + auVar17._16_4_;
    auVar274._20_4_ = auVar15._20_4_ + auVar17._20_4_;
    auVar274._24_4_ = auVar15._24_4_ + auVar17._24_4_;
    auVar274._28_4_ = auVar15._28_4_ + auVar17._28_4_;
    fVar101 = auVar21._0_4_;
    local_2a0 = fVar101 + (float)local_740._0_4_;
    fVar102 = auVar21._4_4_;
    fStack_29c = fVar102 + (float)local_740._4_4_;
    fVar75 = auVar21._8_4_;
    fStack_298 = fVar75 + fStack_738;
    fVar182 = auVar21._12_4_;
    fStack_294 = fVar182 + fStack_734;
    fStack_290 = fStack_730 + 0.0;
    fStack_28c = fStack_72c + 0.0;
    fStack_288 = fStack_728 + 0.0;
    fStack_284 = auVar83._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar209);
    auVar15 = vsubps_avx(local_1e0,auVar31);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    local_200 = ZEXT1632(auVar21);
    auVar15 = vsubps_avx(local_200,_local_740);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    local_240._0_4_ = auVar221._0_4_ + fVar142;
    local_240._4_4_ = auVar221._4_4_ + fVar155;
    local_240._8_4_ = auVar221._8_4_ + fVar156;
    local_240._12_4_ = auVar221._12_4_ + fVar157;
    local_240._16_4_ = fVar158 + 0.0;
    local_240._20_4_ = fVar159 + 0.0;
    local_240._24_4_ = fVar250 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar261 = ZEXT1632(auVar221);
    auVar15 = vsubps_avx(auVar261,auVar40);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    fVar142 = auVar108._0_4_;
    local_280._0_4_ = fVar142 + auVar203._0_4_;
    fVar155 = auVar108._4_4_;
    local_280._4_4_ = fVar155 + auVar203._4_4_;
    fVar156 = auVar108._8_4_;
    local_280._8_4_ = fVar156 + auVar203._8_4_;
    fVar157 = auVar108._12_4_;
    local_280._12_4_ = fVar157 + auVar203._12_4_;
    local_280._16_4_ = auVar203._16_4_ + 0.0;
    local_280._20_4_ = auVar203._20_4_ + 0.0;
    local_280._24_4_ = auVar203._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar15 = vsubps_avx(ZEXT1632(auVar108),auVar203);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar15);
    auVar41._4_4_ = fVar102 * fVar181;
    auVar41._0_4_ = fVar101 * fVar264;
    auVar41._8_4_ = fVar75 * fVar184;
    auVar41._12_4_ = fVar182 * fVar186;
    auVar41._16_4_ = fVar187 * 0.0;
    auVar41._20_4_ = fVar188 * 0.0;
    auVar41._24_4_ = fVar189 * 0.0;
    auVar41._28_4_ = auVar15._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar41,local_1e0,auVar274);
    auVar42._4_4_ = fStack_29c * fVar181;
    auVar42._0_4_ = local_2a0 * fVar264;
    auVar42._8_4_ = fStack_298 * fVar184;
    auVar42._12_4_ = fStack_294 * fVar186;
    auVar42._16_4_ = fStack_290 * fVar187;
    auVar42._20_4_ = fStack_28c * fVar188;
    auVar42._24_4_ = fStack_288 * fVar189;
    auVar42._28_4_ = auVar20._28_4_;
    auVar55._4_4_ = fVar265;
    auVar55._0_4_ = fVar263;
    auVar55._8_4_ = fVar238;
    auVar55._12_4_ = fVar239;
    auVar55._16_4_ = fVar240;
    auVar55._20_4_ = fVar241;
    auVar55._24_4_ = fVar242;
    auVar55._28_4_ = 0x40400000;
    auVar14 = vfnmadd231ps_fma(auVar42,auVar274,auVar55);
    auVar43._4_4_ = local_2c0._4_4_ * fVar181;
    auVar43._0_4_ = local_2c0._0_4_ * fVar264;
    auVar43._8_4_ = local_2c0._8_4_ * fVar184;
    auVar43._12_4_ = local_2c0._12_4_ * fVar186;
    auVar43._16_4_ = local_2c0._16_4_ * fVar187;
    auVar43._20_4_ = local_2c0._20_4_ * fVar188;
    auVar43._24_4_ = local_2c0._24_4_ * fVar189;
    auVar43._28_4_ = fStack_284;
    auVar278 = vfnmadd231ps_fma(auVar43,local_220,auVar274);
    local_720._0_4_ = auVar18._0_4_;
    local_720._4_4_ = auVar18._4_4_;
    uStack_718._0_4_ = auVar18._8_4_;
    uStack_718._4_4_ = auVar18._12_4_;
    uStack_710._0_4_ = auVar18._16_4_;
    uStack_710._4_4_ = auVar18._20_4_;
    uStack_708._0_4_ = auVar18._24_4_;
    auVar44._4_4_ = fVar181 * (float)local_720._4_4_;
    auVar44._0_4_ = fVar264 * (float)local_720._0_4_;
    auVar44._8_4_ = fVar184 * (float)uStack_718;
    auVar44._12_4_ = fVar186 * uStack_718._4_4_;
    auVar44._16_4_ = fVar187 * (float)uStack_710;
    auVar44._20_4_ = fVar188 * uStack_710._4_4_;
    auVar44._24_4_ = fVar189 * (float)uStack_708;
    auVar44._28_4_ = local_2c0._28_4_;
    auVar6 = vfnmadd231ps_fma(auVar44,local_4e0,auVar274);
    auVar61._4_4_ = fVar155 * fVar181;
    auVar61._0_4_ = fVar142 * fVar264;
    auVar61._8_4_ = fVar156 * fVar184;
    auVar61._12_4_ = fVar157 * fVar186;
    auVar61._16_4_ = fVar187 * 0.0;
    auVar61._20_4_ = fVar188 * 0.0;
    auVar61._24_4_ = fVar189 * 0.0;
    auVar61._28_4_ = DAT_0205d4a0._28_4_;
    auVar221 = vfnmadd231ps_fma(auVar61,auVar261,auVar274);
    auVar45._4_4_ = local_280._4_4_ * fVar181;
    auVar45._0_4_ = local_280._0_4_ * fVar264;
    auVar45._8_4_ = local_280._8_4_ * fVar184;
    auVar45._12_4_ = local_280._12_4_ * fVar186;
    auVar45._16_4_ = local_280._16_4_ * fVar187;
    auVar45._20_4_ = local_280._20_4_ * fVar188;
    auVar45._24_4_ = local_280._24_4_ * fVar189;
    auVar45._28_4_ = local_4e0._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar45,local_240,auVar274);
    auVar46._4_4_ = local_260._4_4_ * fVar181;
    auVar46._0_4_ = local_260._0_4_ * fVar264;
    auVar46._8_4_ = local_260._8_4_ * fVar184;
    auVar46._12_4_ = local_260._12_4_ * fVar186;
    auVar46._16_4_ = local_260._16_4_ * fVar187;
    auVar46._20_4_ = local_260._20_4_ * fVar188;
    auVar46._24_4_ = local_260._24_4_ * fVar189;
    auVar46._28_4_ = local_220._28_4_;
    auVar209 = vfnmadd231ps_fma(auVar46,auVar274,auVar20);
    auVar47._4_4_ = local_1c0._4_4_ * fVar181;
    auVar47._0_4_ = local_1c0._0_4_ * fVar264;
    auVar47._8_4_ = local_1c0._8_4_ * fVar184;
    auVar47._12_4_ = local_1c0._12_4_ * fVar186;
    auVar47._16_4_ = local_1c0._16_4_ * fVar187;
    auVar47._20_4_ = local_1c0._20_4_ * fVar188;
    auVar47._24_4_ = local_1c0._24_4_ * fVar189;
    auVar47._28_4_ = auVar81._28_4_ + auVar16._28_4_;
    auVar21 = vfnmadd231ps_fma(auVar47,auVar274,auVar19);
    auVar15 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
    auVar81 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
    auVar83 = vminps_avx(ZEXT1632(auVar278),ZEXT1632(auVar6));
    auVar83 = vminps_avx(auVar15,auVar83);
    auVar15 = vmaxps_avx(ZEXT1632(auVar278),ZEXT1632(auVar6));
    auVar81 = vmaxps_avx(auVar81,auVar15);
    auVar16 = vminps_avx(ZEXT1632(auVar221),ZEXT1632(auVar76));
    auVar15 = vmaxps_avx(ZEXT1632(auVar221),ZEXT1632(auVar76));
    auVar17 = vminps_avx(ZEXT1632(auVar209),ZEXT1632(auVar21));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar83,auVar16);
    auVar83 = vmaxps_avx(ZEXT1632(auVar209),ZEXT1632(auVar21));
    auVar15 = vmaxps_avx(auVar15,auVar83);
    auVar15 = vmaxps_avx(auVar81,auVar15);
    auVar60._4_4_ = fStack_2dc;
    auVar60._0_4_ = local_2e0;
    auVar60._8_4_ = fStack_2d8;
    auVar60._12_4_ = fStack_2d4;
    auVar60._16_4_ = fStack_2d0;
    auVar60._20_4_ = fStack_2cc;
    auVar60._24_4_ = fStack_2c8;
    auVar60._28_4_ = fStack_2c4;
    auVar81 = vcmpps_avx(auVar16,auVar60,2);
    auVar59._4_4_ = fStack_2fc;
    auVar59._0_4_ = local_300;
    auVar59._8_4_ = fStack_2f8;
    auVar59._12_4_ = fStack_2f4;
    auVar59._16_4_ = fStack_2f0;
    auVar59._20_4_ = fStack_2ec;
    auVar59._24_4_ = fStack_2e8;
    auVar59._28_4_ = fStack_2e4;
    auVar15 = vcmpps_avx(auVar15,auVar59,5);
    auVar81 = vandps_avx(auVar15,auVar81);
    auVar15 = local_3c0 & auVar81;
    uVar64 = 0;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(local_4e0,local_1e0);
      auVar83 = vsubps_avx(auVar19,auVar261);
      fVar159 = auVar15._0_4_ + auVar83._0_4_;
      fVar250 = auVar15._4_4_ + auVar83._4_4_;
      fVar264 = auVar15._8_4_ + auVar83._8_4_;
      fVar181 = auVar15._12_4_ + auVar83._12_4_;
      fVar184 = auVar15._16_4_ + auVar83._16_4_;
      fVar186 = auVar15._20_4_ + auVar83._20_4_;
      fVar187 = auVar15._24_4_ + auVar83._24_4_;
      auVar16 = vsubps_avx(auVar18,local_200);
      auVar17 = vsubps_avx(local_1c0,ZEXT1632(auVar108));
      auVar99._0_4_ = auVar16._0_4_ + auVar17._0_4_;
      auVar99._4_4_ = auVar16._4_4_ + auVar17._4_4_;
      auVar99._8_4_ = auVar16._8_4_ + auVar17._8_4_;
      auVar99._12_4_ = auVar16._12_4_ + auVar17._12_4_;
      auVar99._16_4_ = auVar16._16_4_ + auVar17._16_4_;
      auVar99._20_4_ = auVar16._20_4_ + auVar17._20_4_;
      auVar99._24_4_ = auVar16._24_4_ + auVar17._24_4_;
      fVar158 = auVar17._28_4_;
      auVar99._28_4_ = auVar16._28_4_ + fVar158;
      auVar284._0_4_ = fVar101 * fVar159;
      auVar284._4_4_ = fVar102 * fVar250;
      auVar284._8_4_ = fVar75 * fVar264;
      auVar284._12_4_ = fVar182 * fVar181;
      auVar284._16_4_ = fVar184 * 0.0;
      auVar284._20_4_ = fVar186 * 0.0;
      auVar284._24_4_ = fVar187 * 0.0;
      auVar284._28_4_ = 0;
      auVar221 = vfnmadd231ps_fma(auVar284,auVar99,local_1e0);
      auVar48._4_4_ = fVar250 * fStack_29c;
      auVar48._0_4_ = fVar159 * local_2a0;
      auVar48._8_4_ = fVar264 * fStack_298;
      auVar48._12_4_ = fVar181 * fStack_294;
      auVar48._16_4_ = fVar184 * fStack_290;
      auVar48._20_4_ = fVar186 * fStack_28c;
      auVar48._24_4_ = fVar187 * fStack_288;
      auVar48._28_4_ = fVar158;
      auVar56._4_4_ = fVar265;
      auVar56._0_4_ = fVar263;
      auVar56._8_4_ = fVar238;
      auVar56._12_4_ = fVar239;
      auVar56._16_4_ = fVar240;
      auVar56._20_4_ = fVar241;
      auVar56._24_4_ = fVar242;
      auVar56._28_4_ = 0x40400000;
      auVar13 = vfnmadd213ps_fma(auVar56,auVar99,auVar48);
      auVar49._4_4_ = fVar250 * local_2c0._4_4_;
      auVar49._0_4_ = fVar159 * local_2c0._0_4_;
      auVar49._8_4_ = fVar264 * local_2c0._8_4_;
      auVar49._12_4_ = fVar181 * local_2c0._12_4_;
      auVar49._16_4_ = fVar184 * local_2c0._16_4_;
      auVar49._20_4_ = fVar186 * local_2c0._20_4_;
      auVar49._24_4_ = fVar187 * local_2c0._24_4_;
      auVar49._28_4_ = fVar158;
      auVar14 = vfnmadd213ps_fma(local_220,auVar99,auVar49);
      auVar50._4_4_ = (float)local_720._4_4_ * fVar250;
      auVar50._0_4_ = (float)local_720._0_4_ * fVar159;
      auVar50._8_4_ = (float)uStack_718 * fVar264;
      auVar50._12_4_ = uStack_718._4_4_ * fVar181;
      auVar50._16_4_ = (float)uStack_710 * fVar184;
      auVar50._20_4_ = uStack_710._4_4_ * fVar186;
      auVar50._24_4_ = (float)uStack_708 * fVar187;
      auVar50._28_4_ = fVar158;
      auVar108 = vfnmadd231ps_fma(auVar50,auVar99,local_4e0);
      auVar115._0_4_ = fVar142 * fVar159;
      auVar115._4_4_ = fVar155 * fVar250;
      auVar115._8_4_ = fVar156 * fVar264;
      auVar115._12_4_ = fVar157 * fVar181;
      auVar115._16_4_ = fVar184 * 0.0;
      auVar115._20_4_ = fVar186 * 0.0;
      auVar115._24_4_ = fVar187 * 0.0;
      auVar115._28_4_ = 0;
      auVar76 = vfnmadd231ps_fma(auVar115,auVar99,auVar261);
      auVar51._4_4_ = fVar250 * local_280._4_4_;
      auVar51._0_4_ = fVar159 * local_280._0_4_;
      auVar51._8_4_ = fVar264 * local_280._8_4_;
      auVar51._12_4_ = fVar181 * local_280._12_4_;
      auVar51._16_4_ = fVar184 * local_280._16_4_;
      auVar51._20_4_ = fVar186 * local_280._20_4_;
      auVar51._24_4_ = fVar187 * local_280._24_4_;
      auVar51._28_4_ = auVar18._28_4_;
      auVar278 = vfnmadd213ps_fma(local_240,auVar99,auVar51);
      auVar52._4_4_ = fVar250 * local_260._4_4_;
      auVar52._0_4_ = fVar159 * local_260._0_4_;
      auVar52._8_4_ = fVar264 * local_260._8_4_;
      auVar52._12_4_ = fVar181 * local_260._12_4_;
      auVar52._16_4_ = fVar184 * local_260._16_4_;
      auVar52._20_4_ = fVar186 * local_260._20_4_;
      auVar52._24_4_ = fVar187 * local_260._24_4_;
      auVar52._28_4_ = auVar18._28_4_;
      auVar6 = vfnmadd213ps_fma(auVar20,auVar99,auVar52);
      auVar53._4_4_ = local_1c0._4_4_ * fVar250;
      auVar53._0_4_ = local_1c0._0_4_ * fVar159;
      auVar53._8_4_ = local_1c0._8_4_ * fVar264;
      auVar53._12_4_ = local_1c0._12_4_ * fVar181;
      auVar53._16_4_ = local_1c0._16_4_ * fVar184;
      auVar53._20_4_ = local_1c0._20_4_ * fVar186;
      auVar53._24_4_ = local_1c0._24_4_ * fVar187;
      auVar53._28_4_ = auVar15._28_4_ + auVar83._28_4_;
      auVar209 = vfnmadd231ps_fma(auVar53,auVar99,auVar19);
      auVar83 = vminps_avx(ZEXT1632(auVar221),ZEXT1632(auVar13));
      auVar15 = vmaxps_avx(ZEXT1632(auVar221),ZEXT1632(auVar13));
      auVar16 = vminps_avx(ZEXT1632(auVar14),ZEXT1632(auVar108));
      auVar16 = vminps_avx(auVar83,auVar16);
      auVar83 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar108));
      auVar15 = vmaxps_avx(auVar15,auVar83);
      auVar17 = vminps_avx(ZEXT1632(auVar76),ZEXT1632(auVar278));
      auVar83 = vmaxps_avx(ZEXT1632(auVar76),ZEXT1632(auVar278));
      auVar18 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar209));
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar209));
      auVar83 = vmaxps_avx(auVar83,auVar16);
      auVar83 = vmaxps_avx(auVar15,auVar83);
      auVar15 = vcmpps_avx(auVar17,auVar60,2);
      auVar83 = vcmpps_avx(auVar83,auVar59,5);
      auVar15 = vandps_avx(auVar83,auVar15);
      auVar81 = vandps_avx(auVar81,local_3c0);
      auVar83 = auVar81 & auVar15;
      if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar83 >> 0x7f,0) != '\0') ||
            (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar83 >> 0xbf,0) != '\0') ||
          (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar83[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar15,auVar81);
        uVar64 = vmovmskps_avx(auVar81);
      }
    }
    if (uVar64 != 0) {
      auStack_4f0[uVar66] = uVar64;
      uVar161 = vmovlps_avx(local_460);
      *(undefined8 *)(&uStack_3a0 + uVar66 * 2) = uVar161;
      uVar71 = vmovlps_avx(local_780);
      auStack_1a0[uVar66] = uVar71;
      uVar66 = (ulong)((int)uVar66 + 1);
    }
    do {
      if ((int)uVar66 == 0) {
        uVar74 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar84._4_4_ = uVar74;
        auVar84._0_4_ = uVar74;
        auVar84._8_4_ = uVar74;
        auVar84._12_4_ = uVar74;
        auVar84._16_4_ = uVar74;
        auVar84._20_4_ = uVar74;
        auVar84._24_4_ = uVar74;
        auVar84._28_4_ = uVar74;
        auVar81 = vcmpps_avx(local_320,auVar84,2);
        uVar62 = vmovmskps_avx(auVar81);
        uVar62 = (uint)uVar72 & uVar62;
        if (uVar62 == 0) {
          return;
        }
        goto LAB_018623e4;
      }
      uVar65 = (int)uVar66 - 1;
      uVar67 = (ulong)uVar65;
      uVar70 = auStack_4f0[uVar67];
      uVar64 = (&uStack_3a0)[uVar67 * 2];
      fVar142 = afStack_39c[uVar67 * 2];
      iVar63 = 0;
      for (uVar71 = (ulong)uVar70; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        iVar63 = iVar63 + 1;
      }
      uVar70 = uVar70 - 1 & uVar70;
      if (uVar70 == 0) {
        uVar66 = (ulong)uVar65;
      }
      local_780._8_8_ = 0;
      local_780._0_8_ = auStack_1a0[uVar67];
      auStack_4f0[uVar67] = uVar70;
      fVar155 = (float)(iVar63 + 1) * 0.14285715;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * (float)iVar63 * 0.14285715)),
                                ZEXT416(uVar64),ZEXT416((uint)(1.0 - (float)iVar63 * 0.14285715)));
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar155)),ZEXT416(uVar64),
                                ZEXT416((uint)(1.0 - fVar155)));
      auVar179._0_4_ = auVar13._0_4_;
      fVar155 = auVar14._0_4_;
      fVar142 = fVar155 - auVar179._0_4_;
      if (0.16666667 <= fVar142) break;
      auVar278 = vshufps_avx(local_780,local_780,0x50);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar6 = vsubps_avx(auVar105,auVar278);
      fVar156 = auVar278._0_4_;
      auVar119._0_4_ = fVar156 * (float)local_550._0_4_;
      fVar157 = auVar278._4_4_;
      auVar119._4_4_ = fVar157 * (float)local_550._4_4_;
      fVar101 = auVar278._8_4_;
      auVar119._8_4_ = fVar101 * fStack_548;
      fVar102 = auVar278._12_4_;
      auVar119._12_4_ = fVar102 * fStack_544;
      auVar130._0_4_ = fVar156 * (float)local_560._0_4_;
      auVar130._4_4_ = fVar157 * (float)local_560._4_4_;
      auVar130._8_4_ = fVar101 * fStack_558;
      auVar130._12_4_ = fVar102 * fStack_554;
      auVar147._0_4_ = fVar156 * (float)local_570._0_4_;
      auVar147._4_4_ = fVar157 * (float)local_570._4_4_;
      auVar147._8_4_ = fVar101 * fStack_568;
      auVar147._12_4_ = fVar102 * fStack_564;
      auVar90._0_4_ = fVar156 * (float)local_580._0_4_;
      auVar90._4_4_ = fVar157 * (float)local_580._4_4_;
      auVar90._8_4_ = fVar101 * fStack_578;
      auVar90._12_4_ = fVar102 * fStack_574;
      auVar278 = vfmadd231ps_fma(auVar119,auVar6,local_510);
      auVar221 = vfmadd231ps_fma(auVar130,auVar6,local_520);
      auVar108 = vfmadd231ps_fma(auVar147,auVar6,local_530);
      auVar6 = vfmadd231ps_fma(auVar90,auVar6,local_540);
      auVar116._16_16_ = auVar278;
      auVar116._0_16_ = auVar278;
      auVar127._16_16_ = auVar221;
      auVar127._0_16_ = auVar221;
      auVar141._16_16_ = auVar108;
      auVar141._0_16_ = auVar108;
      auVar179._4_4_ = auVar179._0_4_;
      auVar179._8_4_ = auVar179._0_4_;
      auVar179._12_4_ = auVar179._0_4_;
      auVar179._20_4_ = fVar155;
      auVar179._16_4_ = fVar155;
      auVar179._24_4_ = fVar155;
      auVar179._28_4_ = fVar155;
      auVar81 = vsubps_avx(auVar127,auVar116);
      auVar221 = vfmadd213ps_fma(auVar81,auVar179,auVar116);
      auVar81 = vsubps_avx(auVar141,auVar127);
      auVar76 = vfmadd213ps_fma(auVar81,auVar179,auVar127);
      auVar278 = vsubps_avx(auVar6,auVar108);
      auVar128._16_16_ = auVar278;
      auVar128._0_16_ = auVar278;
      auVar278 = vfmadd213ps_fma(auVar128,auVar179,auVar141);
      auVar81 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar221));
      auVar6 = vfmadd213ps_fma(auVar81,auVar179,ZEXT1632(auVar221));
      auVar81 = vsubps_avx(ZEXT1632(auVar278),ZEXT1632(auVar76));
      auVar278 = vfmadd213ps_fma(auVar81,auVar179,ZEXT1632(auVar76));
      auVar81 = vsubps_avx(ZEXT1632(auVar278),ZEXT1632(auVar6));
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar81,auVar179);
      fVar182 = auVar81._4_4_ * 3.0;
      fVar75 = fVar142 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar22._4_4_ + fVar75 * fVar182,auVar22._0_4_ + fVar75 * auVar81._0_4_ * 3.0);
      local_4e0._8_4_ = auVar22._8_4_ + fVar75 * auVar81._8_4_ * 3.0;
      local_4e0._12_4_ = auVar22._12_4_ + fVar75 * auVar81._12_4_ * 3.0;
      auVar6 = vshufpd_avx(auVar22,auVar22,3);
      auVar221 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar278 = vsubps_avx(auVar6,auVar22);
      auVar108 = vsubps_avx(auVar221,(undefined1  [16])0x0);
      auVar106._0_4_ = auVar278._0_4_ + auVar108._0_4_;
      auVar106._4_4_ = auVar278._4_4_ + auVar108._4_4_;
      auVar106._8_4_ = auVar278._8_4_ + auVar108._8_4_;
      auVar106._12_4_ = auVar278._12_4_ + auVar108._12_4_;
      auVar278 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar108 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar266._4_4_ = auVar106._0_4_;
      auVar266._0_4_ = auVar106._0_4_;
      auVar266._8_4_ = auVar106._0_4_;
      auVar266._12_4_ = auVar106._0_4_;
      auVar76 = vshufps_avx(auVar106,auVar106,0x55);
      fVar156 = auVar76._0_4_;
      auVar193._0_4_ = auVar278._0_4_ * fVar156;
      fVar157 = auVar76._4_4_;
      auVar193._4_4_ = auVar278._4_4_ * fVar157;
      fVar101 = auVar76._8_4_;
      auVar193._8_4_ = auVar278._8_4_ * fVar101;
      fVar102 = auVar76._12_4_;
      auVar193._12_4_ = auVar278._12_4_ * fVar102;
      auVar207._0_4_ = auVar108._0_4_ * fVar156;
      auVar207._4_4_ = auVar108._4_4_ * fVar157;
      auVar207._8_4_ = auVar108._8_4_ * fVar101;
      auVar207._12_4_ = auVar108._12_4_ * fVar102;
      auVar209 = vfmadd231ps_fma(auVar193,auVar266,auVar22);
      auVar21 = vfmadd231ps_fma(auVar207,auVar266,local_4e0._0_16_);
      auVar108 = vshufps_avx(auVar209,auVar209,0xe8);
      auVar76 = vshufps_avx(auVar21,auVar21,0xe8);
      auVar278 = vcmpps_avx(auVar108,auVar76,1);
      uVar64 = vextractps_avx(auVar278,0);
      auVar77 = auVar21;
      if ((uVar64 & 1) == 0) {
        auVar77 = auVar209;
      }
      auVar131._0_4_ = fVar75 * auVar81._16_4_ * 3.0;
      auVar131._4_4_ = fVar75 * fVar182;
      auVar131._8_4_ = fVar75 * auVar81._24_4_ * 3.0;
      auVar131._12_4_ = fVar75 * fVar155;
      auVar87 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar132 = vshufps_avx(auVar87,auVar87,0xb1);
      auVar78 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar286._0_4_ = auVar132._0_4_ * fVar156;
      auVar286._4_4_ = auVar132._4_4_ * fVar157;
      auVar286._8_4_ = auVar132._8_4_ * fVar101;
      auVar286._12_4_ = auVar132._12_4_ * fVar102;
      auVar107._0_4_ = auVar78._0_4_ * fVar156;
      auVar107._4_4_ = auVar78._4_4_ * fVar157;
      auVar107._8_4_ = auVar78._8_4_ * fVar101;
      auVar107._12_4_ = auVar78._12_4_ * fVar102;
      auVar88 = vfmadd231ps_fma(auVar286,auVar266,auVar87);
      auVar89 = vfmadd231ps_fma(auVar107,(undefined1  [16])0x0,auVar266);
      auVar78 = vshufps_avx(auVar88,auVar88,0xe8);
      auVar86 = vshufps_avx(auVar89,auVar89,0xe8);
      auVar132 = vcmpps_avx(auVar78,auVar86,1);
      uVar64 = vextractps_avx(auVar132,0);
      auVar103 = auVar89;
      if ((uVar64 & 1) == 0) {
        auVar103 = auVar88;
      }
      auVar77 = vmaxss_avx(auVar103,auVar77);
      auVar108 = vminps_avx(auVar108,auVar76);
      auVar76 = vminps_avx(auVar78,auVar86);
      auVar76 = vminps_avx(auVar108,auVar76);
      auVar278 = vshufps_avx(auVar278,auVar278,0x55);
      auVar278 = vblendps_avx(auVar278,auVar132,2);
      auVar132 = vpslld_avx(auVar278,0x1f);
      auVar278 = vshufpd_avx(auVar21,auVar21,1);
      auVar278 = vinsertps_avx(auVar278,auVar89,0x9c);
      auVar108 = vshufpd_avx(auVar209,auVar209,1);
      auVar108 = vinsertps_avx(auVar108,auVar88,0x9c);
      auVar278 = vblendvps_avx(auVar108,auVar278,auVar132);
      auVar108 = vmovshdup_avx(auVar278);
      auVar278 = vmaxss_avx(auVar108,auVar278);
      fVar101 = auVar76._0_4_;
      auVar108 = vmovshdup_avx(auVar76);
      fVar157 = auVar278._0_4_;
      fVar156 = auVar77._0_4_;
      if ((0.0001 <= fVar101) || (fVar157 <= -0.0001)) {
        auVar209 = vcmpps_avx(auVar108,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar21 = vcmpps_avx(auVar76,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar209 = vorps_avx(auVar21,auVar209);
        if ((-0.0001 < fVar156 & auVar209[0]) != 0) goto LAB_018634b4;
        auVar209 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar278,5);
        auVar21 = vcmpps_avx(auVar108,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar209 = vorps_avx(auVar21,auVar209);
        if ((auVar209 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_018634b4;
LAB_01863e59:
        bVar54 = true;
      }
      else {
LAB_018634b4:
        auVar21 = vcmpps_avx(auVar76,_DAT_01feba10,1);
        auVar132 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar209 = vcmpss_avx(auVar77,ZEXT816(0) << 0x20,1);
        auVar148._8_4_ = 0x3f800000;
        auVar148._0_8_ = &DAT_3f8000003f800000;
        auVar148._12_4_ = 0x3f800000;
        auVar208._8_4_ = 0xbf800000;
        auVar208._0_8_ = 0xbf800000bf800000;
        auVar208._12_4_ = 0xbf800000;
        auVar209 = vblendvps_avx(auVar148,auVar208,auVar209);
        auVar21 = vblendvps_avx(auVar148,auVar208,auVar21);
        fVar102 = auVar21._0_4_;
        fVar75 = auVar209._0_4_;
        auVar209 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar78 = ZEXT816(0) << 0x20;
        if ((fVar102 == fVar75) && (!NAN(fVar102) && !NAN(fVar75))) {
          auVar209 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar102 == fVar75) && (!NAN(fVar102) && !NAN(fVar75))) {
          auVar132 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar21 = vmovshdup_avx(auVar21);
        fVar182 = auVar21._0_4_;
        if ((fVar102 != fVar182) || (NAN(fVar102) || NAN(fVar182))) {
          fVar102 = auVar108._0_4_;
          if ((fVar102 != fVar101) || (NAN(fVar102) || NAN(fVar101))) {
            auVar109._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar109._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar109._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar133._0_4_ = -fVar101 / (fVar102 - fVar101);
            auVar133._4_12_ = auVar109._4_12_;
            auVar108 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar133._0_4_)),auVar78,auVar133);
            auVar76 = auVar108;
          }
          else {
            auVar108 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar101 == 0.0) && (auVar108 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar101))) {
              auVar108 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar101 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar101))) {
              auVar76 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar209 = vminss_avx(auVar209,auVar108);
          auVar132 = vmaxss_avx(auVar76,auVar132);
        }
        auVar278 = vcmpss_avx(auVar278,auVar78,1);
        auVar134._8_4_ = 0x3f800000;
        auVar134._0_8_ = &DAT_3f8000003f800000;
        auVar134._12_4_ = 0x3f800000;
        auVar149._8_4_ = 0xbf800000;
        auVar149._0_8_ = 0xbf800000bf800000;
        auVar149._12_4_ = 0xbf800000;
        auVar278 = vblendvps_avx(auVar134,auVar149,auVar278);
        fVar101 = auVar278._0_4_;
        auVar278 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar75 != fVar101) || (NAN(fVar75) || NAN(fVar101))) {
          if ((fVar157 != fVar156) || (NAN(fVar157) || NAN(fVar156))) {
            auVar110._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
            auVar110._8_4_ = auVar77._8_4_ ^ 0x80000000;
            auVar110._12_4_ = auVar77._12_4_ ^ 0x80000000;
            auVar135._0_4_ = -fVar156 / (fVar157 - fVar156);
            auVar135._4_12_ = auVar110._4_12_;
            auVar108 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar135._0_4_)),auVar78,auVar135);
            auVar76 = auVar108;
          }
          else {
            auVar108 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar156 == 0.0) && (auVar108 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar156))) {
              auVar108 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar156 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar156))) {
              auVar76 = auVar278;
            }
          }
          auVar209 = vminss_avx(auVar209,auVar108);
          auVar132 = vmaxss_avx(auVar76,auVar132);
        }
        if ((fVar182 != fVar101) || (NAN(fVar182) || NAN(fVar101))) {
          auVar209 = vminss_avx(auVar209,auVar278);
          auVar132 = vmaxss_avx(auVar278,auVar132);
        }
        auVar108 = vmaxss_avx(auVar78,auVar209);
        auVar76 = vminss_avx(auVar132,auVar278);
        bVar54 = true;
        if (auVar108._0_4_ <= auVar76._0_4_) {
          auVar108 = vmaxss_avx(auVar78,ZEXT416((uint)(auVar108._0_4_ + -0.1)));
          auVar278 = vminss_avx(ZEXT416((uint)(auVar76._0_4_ + 0.1)),auVar278);
          auVar91._0_8_ = auVar22._0_8_;
          auVar91._8_8_ = auVar91._0_8_;
          auVar210._8_8_ = local_4e0._0_8_;
          auVar210._0_8_ = local_4e0._0_8_;
          auVar225._8_8_ = auVar87._0_8_;
          auVar225._0_8_ = auVar87._0_8_;
          auVar76 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
          auVar209 = vshufpd_avx(auVar87,auVar87,3);
          auVar21 = vshufps_avx(auVar108,auVar278,0);
          auVar120._8_4_ = 0x3f800000;
          auVar120._0_8_ = &DAT_3f8000003f800000;
          auVar120._12_4_ = 0x3f800000;
          auVar22 = vsubps_avx(auVar120,auVar21);
          local_740._0_4_ = auVar6._0_4_;
          local_740._4_4_ = auVar6._4_4_;
          fStack_738 = auVar6._8_4_;
          fStack_734 = auVar6._12_4_;
          fVar156 = auVar21._0_4_;
          auVar121._0_4_ = fVar156 * (float)local_740._0_4_;
          fVar157 = auVar21._4_4_;
          auVar121._4_4_ = fVar157 * (float)local_740._4_4_;
          fVar101 = auVar21._8_4_;
          auVar121._8_4_ = fVar101 * fStack_738;
          fVar102 = auVar21._12_4_;
          auVar121._12_4_ = fVar102 * fStack_734;
          auVar136._0_4_ = auVar76._0_4_ * fVar156;
          auVar136._4_4_ = auVar76._4_4_ * fVar157;
          auVar136._8_4_ = auVar76._8_4_ * fVar101;
          auVar136._12_4_ = auVar76._12_4_ * fVar102;
          auVar150._0_4_ = auVar209._0_4_ * fVar156;
          auVar150._4_4_ = auVar209._4_4_ * fVar157;
          auVar150._8_4_ = auVar209._8_4_ * fVar101;
          auVar150._12_4_ = auVar209._12_4_ * fVar102;
          local_720._0_4_ = auVar221._0_4_;
          local_720._4_4_ = auVar221._4_4_;
          uStack_718._0_4_ = auVar221._8_4_;
          uStack_718._4_4_ = auVar221._12_4_;
          auVar173._0_4_ = fVar156 * (float)local_720._0_4_;
          auVar173._4_4_ = fVar157 * (float)local_720._4_4_;
          auVar173._8_4_ = fVar101 * (float)uStack_718;
          auVar173._12_4_ = fVar102 * uStack_718._4_4_;
          auVar76 = vfmadd231ps_fma(auVar121,auVar22,auVar91);
          auVar209 = vfmadd231ps_fma(auVar136,auVar22,auVar210);
          auVar21 = vfmadd231ps_fma(auVar150,auVar22,auVar225);
          auVar22 = vfmadd231ps_fma(auVar173,auVar22,ZEXT816(0));
          auVar6 = vmovshdup_avx(local_780);
          auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar108._0_4_)),local_780,
                                    ZEXT416((uint)(1.0 - auVar108._0_4_)));
          auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar278._0_4_)),local_780,
                                    ZEXT416((uint)(1.0 - auVar278._0_4_)));
          fVar156 = 1.0 / fVar142;
          auVar278 = vsubps_avx(auVar209,auVar76);
          auVar194._0_4_ = auVar278._0_4_ * 3.0;
          auVar194._4_4_ = auVar278._4_4_ * 3.0;
          auVar194._8_4_ = auVar278._8_4_ * 3.0;
          auVar194._12_4_ = auVar278._12_4_ * 3.0;
          auVar278 = vsubps_avx(auVar21,auVar209);
          auVar211._0_4_ = auVar278._0_4_ * 3.0;
          auVar211._4_4_ = auVar278._4_4_ * 3.0;
          auVar211._8_4_ = auVar278._8_4_ * 3.0;
          auVar211._12_4_ = auVar278._12_4_ * 3.0;
          auVar278 = vsubps_avx(auVar22,auVar21);
          auVar226._0_4_ = auVar278._0_4_ * 3.0;
          auVar226._4_4_ = auVar278._4_4_ * 3.0;
          auVar226._8_4_ = auVar278._8_4_ * 3.0;
          auVar226._12_4_ = auVar278._12_4_ * 3.0;
          auVar6 = vminps_avx(auVar211,auVar226);
          auVar278 = vmaxps_avx(auVar211,auVar226);
          auVar6 = vminps_avx(auVar194,auVar6);
          auVar278 = vmaxps_avx(auVar194,auVar278);
          auVar221 = vshufpd_avx(auVar6,auVar6,3);
          auVar108 = vshufpd_avx(auVar278,auVar278,3);
          auVar6 = vminps_avx(auVar6,auVar221);
          auVar278 = vmaxps_avx(auVar278,auVar108);
          auVar212._0_4_ = auVar6._0_4_ * fVar156;
          auVar212._4_4_ = auVar6._4_4_ * fVar156;
          auVar212._8_4_ = auVar6._8_4_ * fVar156;
          auVar212._12_4_ = auVar6._12_4_ * fVar156;
          auVar195._0_4_ = fVar156 * auVar278._0_4_;
          auVar195._4_4_ = fVar156 * auVar278._4_4_;
          auVar195._8_4_ = fVar156 * auVar278._8_4_;
          auVar195._12_4_ = fVar156 * auVar278._12_4_;
          fVar156 = 1.0 / (auVar86._0_4_ - auVar78._0_4_);
          auVar278 = vshufpd_avx(auVar76,auVar76,3);
          auVar6 = vshufpd_avx(auVar209,auVar209,3);
          auVar221 = vshufpd_avx(auVar21,auVar21,3);
          auVar108 = vshufpd_avx(auVar22,auVar22,3);
          auVar278 = vsubps_avx(auVar278,auVar76);
          auVar76 = vsubps_avx(auVar6,auVar209);
          auVar209 = vsubps_avx(auVar221,auVar21);
          auVar108 = vsubps_avx(auVar108,auVar22);
          auVar6 = vminps_avx(auVar278,auVar76);
          auVar278 = vmaxps_avx(auVar278,auVar76);
          auVar221 = vminps_avx(auVar209,auVar108);
          auVar221 = vminps_avx(auVar6,auVar221);
          auVar6 = vmaxps_avx(auVar209,auVar108);
          auVar278 = vmaxps_avx(auVar278,auVar6);
          auVar244._0_4_ = fVar156 * auVar221._0_4_;
          auVar244._4_4_ = fVar156 * auVar221._4_4_;
          auVar244._8_4_ = fVar156 * auVar221._8_4_;
          auVar244._12_4_ = fVar156 * auVar221._12_4_;
          auVar232._0_4_ = fVar156 * auVar278._0_4_;
          auVar232._4_4_ = fVar156 * auVar278._4_4_;
          auVar232._8_4_ = fVar156 * auVar278._8_4_;
          auVar232._12_4_ = fVar156 * auVar278._12_4_;
          auVar108 = vinsertps_avx(auVar13,auVar78,0x10);
          auVar76 = vinsertps_avx(auVar14,auVar86,0x10);
          auVar80._0_4_ = (auVar108._0_4_ + auVar76._0_4_) * 0.5;
          auVar80._4_4_ = (auVar108._4_4_ + auVar76._4_4_) * 0.5;
          auVar80._8_4_ = (auVar108._8_4_ + auVar76._8_4_) * 0.5;
          auVar80._12_4_ = (auVar108._12_4_ + auVar76._12_4_) * 0.5;
          auVar122._4_4_ = auVar80._0_4_;
          auVar122._0_4_ = auVar80._0_4_;
          auVar122._8_4_ = auVar80._0_4_;
          auVar122._12_4_ = auVar80._0_4_;
          auVar278 = vfmadd213ps_fma(local_3d0,auVar122,auVar3);
          auVar6 = vfmadd213ps_fma(local_3e0,auVar122,auVar4);
          auVar221 = vfmadd213ps_fma(local_3f0,auVar122,local_500);
          auVar14 = vsubps_avx(auVar6,auVar278);
          auVar278 = vfmadd213ps_fma(auVar14,auVar122,auVar278);
          auVar14 = vsubps_avx(auVar221,auVar6);
          auVar14 = vfmadd213ps_fma(auVar14,auVar122,auVar6);
          auVar14 = vsubps_avx(auVar14,auVar278);
          auVar278 = vfmadd231ps_fma(auVar278,auVar14,auVar122);
          auVar123._0_8_ = CONCAT44(auVar14._4_4_ * 3.0,auVar14._0_4_ * 3.0);
          auVar123._8_4_ = auVar14._8_4_ * 3.0;
          auVar123._12_4_ = auVar14._12_4_ * 3.0;
          auVar227._8_8_ = auVar278._0_8_;
          auVar227._0_8_ = auVar278._0_8_;
          auVar14 = vshufpd_avx(auVar278,auVar278,3);
          auVar278 = vshufps_avx(auVar80,auVar80,0x55);
          auVar209 = vsubps_avx(auVar14,auVar227);
          auVar22 = vfmadd231ps_fma(auVar227,auVar278,auVar209);
          auVar267._8_8_ = auVar123._0_8_;
          auVar267._0_8_ = auVar123._0_8_;
          auVar14 = vshufpd_avx(auVar123,auVar123,3);
          auVar14 = vsubps_avx(auVar14,auVar267);
          auVar21 = vfmadd213ps_fma(auVar14,auVar278,auVar267);
          auVar278 = vmovshdup_avx(auVar21);
          auVar268._0_8_ = auVar278._0_8_ ^ 0x8000000080000000;
          auVar268._8_4_ = auVar278._8_4_ ^ 0x80000000;
          auVar268._12_4_ = auVar278._12_4_ ^ 0x80000000;
          auVar6 = vmovshdup_avx(auVar209);
          auVar14 = vunpcklps_avx(auVar6,auVar268);
          auVar221 = vshufps_avx(auVar14,auVar268,4);
          auVar287._0_8_ = auVar209._0_8_ ^ 0x8000000080000000;
          auVar287._8_4_ = auVar209._8_4_ ^ 0x80000000;
          auVar287._12_4_ = auVar209._12_4_ ^ 0x80000000;
          auVar14 = vmovlhps_avx(auVar287,auVar21);
          auVar14 = vshufps_avx(auVar14,auVar21,8);
          auVar278 = vfmsub231ss_fma(ZEXT416((uint)(auVar278._0_4_ * auVar209._0_4_)),auVar6,auVar21
                                    );
          auVar137._0_4_ = auVar278._0_4_;
          auVar137._4_4_ = auVar137._0_4_;
          auVar137._8_4_ = auVar137._0_4_;
          auVar137._12_4_ = auVar137._0_4_;
          auVar278 = vdivps_avx(auVar221,auVar137);
          auVar6 = vdivps_avx(auVar14,auVar137);
          fVar101 = auVar22._0_4_;
          fVar156 = auVar278._0_4_;
          auVar14 = vshufps_avx(auVar22,auVar22,0x55);
          fVar157 = auVar6._0_4_;
          local_720._4_4_ = fVar101 * auVar278._4_4_ + auVar14._4_4_ * auVar6._4_4_;
          local_720._0_4_ = fVar101 * fVar156 + auVar14._0_4_ * fVar157;
          uStack_718._0_4_ = fVar101 * auVar278._8_4_ + auVar14._8_4_ * auVar6._8_4_;
          uStack_718._4_4_ = fVar101 * auVar278._12_4_ + auVar14._12_4_ * auVar6._12_4_;
          auVar209 = vmovshdup_avx(auVar278);
          auVar14 = vinsertps_avx(auVar212,auVar244,0x1c);
          auVar279._0_4_ = auVar209._0_4_ * auVar14._0_4_;
          auVar279._4_4_ = auVar209._4_4_ * auVar14._4_4_;
          auVar279._8_4_ = auVar209._8_4_ * auVar14._8_4_;
          auVar279._12_4_ = auVar209._12_4_ * auVar14._12_4_;
          auVar221 = vinsertps_avx(auVar195,auVar232,0x1c);
          auVar253._0_4_ = auVar209._0_4_ * auVar221._0_4_;
          auVar253._4_4_ = auVar209._4_4_ * auVar221._4_4_;
          auVar253._8_4_ = auVar209._8_4_ * auVar221._8_4_;
          auVar253._12_4_ = auVar209._12_4_ * auVar221._12_4_;
          auVar77 = vminps_avx(auVar279,auVar253);
          auVar22 = vmaxps_avx(auVar253,auVar279);
          auVar209 = vinsertps_avx(auVar244,auVar212,0x4c);
          auVar132 = vmovshdup_avx(auVar6);
          auVar21 = vinsertps_avx(auVar232,auVar195,0x4c);
          auVar233._0_4_ = auVar132._0_4_ * auVar209._0_4_;
          auVar233._4_4_ = auVar132._4_4_ * auVar209._4_4_;
          auVar233._8_4_ = auVar132._8_4_ * auVar209._8_4_;
          auVar233._12_4_ = auVar132._12_4_ * auVar209._12_4_;
          auVar245._0_4_ = auVar132._0_4_ * auVar21._0_4_;
          auVar245._4_4_ = auVar132._4_4_ * auVar21._4_4_;
          auVar245._8_4_ = auVar132._8_4_ * auVar21._8_4_;
          auVar245._12_4_ = auVar132._12_4_ * auVar21._12_4_;
          auVar132 = vminps_avx(auVar233,auVar245);
          auVar92._0_4_ = auVar132._0_4_ + auVar77._0_4_;
          auVar92._4_4_ = auVar132._4_4_ + auVar77._4_4_;
          auVar92._8_4_ = auVar132._8_4_ + auVar77._8_4_;
          auVar92._12_4_ = auVar132._12_4_ + auVar77._12_4_;
          auVar77 = vmaxps_avx(auVar245,auVar233);
          auVar234._0_4_ = auVar22._0_4_ + auVar77._0_4_;
          auVar234._4_4_ = auVar22._4_4_ + auVar77._4_4_;
          auVar234._8_4_ = auVar22._8_4_ + auVar77._8_4_;
          auVar234._12_4_ = auVar22._12_4_ + auVar77._12_4_;
          auVar246._8_8_ = 0x3f80000000000000;
          auVar246._0_8_ = 0x3f80000000000000;
          auVar22 = vsubps_avx(auVar246,auVar234);
          auVar77 = vsubps_avx(auVar246,auVar92);
          auVar132 = vsubps_avx(auVar108,auVar80);
          auVar269._0_4_ = fVar156 * auVar14._0_4_;
          auVar269._4_4_ = fVar156 * auVar14._4_4_;
          auVar269._8_4_ = fVar156 * auVar14._8_4_;
          auVar269._12_4_ = fVar156 * auVar14._12_4_;
          auVar254._0_4_ = fVar156 * auVar221._0_4_;
          auVar254._4_4_ = fVar156 * auVar221._4_4_;
          auVar254._8_4_ = fVar156 * auVar221._8_4_;
          auVar254._12_4_ = fVar156 * auVar221._12_4_;
          auVar221 = vminps_avx(auVar269,auVar254);
          auVar14 = vmaxps_avx(auVar254,auVar269);
          auVar213._0_4_ = fVar157 * auVar209._0_4_;
          auVar213._4_4_ = fVar157 * auVar209._4_4_;
          auVar213._8_4_ = fVar157 * auVar209._8_4_;
          auVar213._12_4_ = fVar157 * auVar209._12_4_;
          auVar196._0_4_ = fVar157 * auVar21._0_4_;
          auVar196._4_4_ = fVar157 * auVar21._4_4_;
          auVar196._8_4_ = fVar157 * auVar21._8_4_;
          auVar196._12_4_ = fVar157 * auVar21._12_4_;
          auVar209 = vminps_avx(auVar213,auVar196);
          auVar270._0_4_ = auVar221._0_4_ + auVar209._0_4_;
          auVar270._4_4_ = auVar221._4_4_ + auVar209._4_4_;
          auVar270._8_4_ = auVar221._8_4_ + auVar209._8_4_;
          auVar270._12_4_ = auVar221._12_4_ + auVar209._12_4_;
          auVar209 = vsubps_avx(auVar76,auVar80);
          auVar221 = vmaxps_avx(auVar196,auVar213);
          fVar101 = auVar132._0_4_;
          auVar214._0_4_ = fVar101 * auVar22._0_4_;
          fVar102 = auVar132._4_4_;
          auVar214._4_4_ = fVar102 * auVar22._4_4_;
          fVar75 = auVar132._8_4_;
          auVar214._8_4_ = fVar75 * auVar22._8_4_;
          fVar182 = auVar132._12_4_;
          auVar214._12_4_ = fVar182 * auVar22._12_4_;
          auVar197._0_4_ = auVar14._0_4_ + auVar221._0_4_;
          auVar197._4_4_ = auVar14._4_4_ + auVar221._4_4_;
          auVar197._8_4_ = auVar14._8_4_ + auVar221._8_4_;
          auVar197._12_4_ = auVar14._12_4_ + auVar221._12_4_;
          auVar255._8_8_ = 0x3f800000;
          auVar255._0_8_ = 0x3f800000;
          auVar14 = vsubps_avx(auVar255,auVar197);
          auVar221 = vsubps_avx(auVar255,auVar270);
          auVar271._0_4_ = fVar101 * auVar77._0_4_;
          auVar271._4_4_ = fVar102 * auVar77._4_4_;
          auVar271._8_4_ = fVar75 * auVar77._8_4_;
          auVar271._12_4_ = fVar182 * auVar77._12_4_;
          fVar158 = auVar209._0_4_;
          auVar235._0_4_ = fVar158 * auVar22._0_4_;
          fVar159 = auVar209._4_4_;
          auVar235._4_4_ = fVar159 * auVar22._4_4_;
          fVar250 = auVar209._8_4_;
          auVar235._8_4_ = fVar250 * auVar22._8_4_;
          fVar263 = auVar209._12_4_;
          auVar235._12_4_ = fVar263 * auVar22._12_4_;
          auVar93._0_4_ = fVar158 * auVar77._0_4_;
          auVar93._4_4_ = fVar159 * auVar77._4_4_;
          auVar93._8_4_ = fVar250 * auVar77._8_4_;
          auVar93._12_4_ = fVar263 * auVar77._12_4_;
          auVar288._0_4_ = fVar101 * auVar14._0_4_;
          auVar288._4_4_ = fVar102 * auVar14._4_4_;
          auVar288._8_4_ = fVar75 * auVar14._8_4_;
          auVar288._12_4_ = fVar182 * auVar14._12_4_;
          auVar247._0_4_ = fVar101 * auVar221._0_4_;
          auVar247._4_4_ = fVar102 * auVar221._4_4_;
          auVar247._8_4_ = fVar75 * auVar221._8_4_;
          auVar247._12_4_ = fVar182 * auVar221._12_4_;
          auVar198._0_4_ = fVar158 * auVar14._0_4_;
          auVar198._4_4_ = fVar159 * auVar14._4_4_;
          auVar198._8_4_ = fVar250 * auVar14._8_4_;
          auVar198._12_4_ = fVar263 * auVar14._12_4_;
          auVar256._0_4_ = fVar158 * auVar221._0_4_;
          auVar256._4_4_ = fVar159 * auVar221._4_4_;
          auVar256._8_4_ = fVar250 * auVar221._8_4_;
          auVar256._12_4_ = fVar263 * auVar221._12_4_;
          auVar14 = vminps_avx(auVar288,auVar247);
          auVar221 = vminps_avx(auVar198,auVar256);
          auVar14 = vminps_avx(auVar14,auVar221);
          auVar221 = vmaxps_avx(auVar247,auVar288);
          auVar209 = vminps_avx(auVar214,auVar271);
          auVar22 = vminps_avx(auVar235,auVar93);
          auVar209 = vminps_avx(auVar209,auVar22);
          auVar14 = vhaddps_avx(auVar14,auVar209);
          auVar209 = vmaxps_avx(auVar256,auVar198);
          auVar221 = vmaxps_avx(auVar209,auVar221);
          auVar209 = vmaxps_avx(auVar271,auVar214);
          auVar21 = vmaxps_avx(auVar93,auVar235);
          auVar209 = vmaxps_avx(auVar21,auVar209);
          auVar221 = vhaddps_avx(auVar221,auVar209);
          auVar209 = vshufps_avx(auVar80,auVar80,0x54);
          auVar209 = vsubps_avx(auVar209,_local_720);
          auVar14 = vshufps_avx(auVar14,auVar14,0xe8);
          auVar221 = vshufps_avx(auVar221,auVar221,0xe8);
          auVar215._0_4_ = auVar209._0_4_ + auVar14._0_4_;
          auVar215._4_4_ = auVar209._4_4_ + auVar14._4_4_;
          auVar215._8_4_ = auVar209._8_4_ + auVar14._8_4_;
          auVar215._12_4_ = auVar209._12_4_ + auVar14._12_4_;
          auVar199._0_4_ = auVar209._0_4_ + auVar221._0_4_;
          auVar199._4_4_ = auVar209._4_4_ + auVar221._4_4_;
          auVar199._8_4_ = auVar209._8_4_ + auVar221._8_4_;
          auVar199._12_4_ = auVar209._12_4_ + auVar221._12_4_;
          auVar14 = vmaxps_avx(auVar108,auVar215);
          auVar221 = vminps_avx(auVar199,auVar76);
          auVar14 = vcmpps_avx(auVar221,auVar14,1);
          auVar14 = vshufps_avx(auVar14,auVar14,0x50);
          local_780 = vinsertps_avx(auVar78,ZEXT416((uint)auVar86._0_4_),0x10);
          if ((auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar14[0xf] < '\0') goto LAB_01863e59;
          bVar69 = 0;
          auVar81 = vpcmpeqd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar22));
          if (auVar215._0_4_ <= auVar179._0_4_) {
            auVar272._8_4_ = 0x7fffffff;
            auVar272._0_8_ = 0x7fffffff7fffffff;
            auVar272._12_4_ = 0x7fffffff;
          }
          else {
            auVar272._8_4_ = 0x7fffffff;
            auVar272._0_8_ = 0x7fffffff7fffffff;
            auVar272._12_4_ = 0x7fffffff;
            bVar69 = 0;
            if (auVar199._0_4_ < auVar76._0_4_) {
              auVar221 = vmovshdup_avx(auVar215);
              auVar14 = vcmpps_avx(auVar199,auVar76,1);
              bVar69 = auVar14[4] & auVar78._0_4_ < auVar221._0_4_;
            }
          }
          if (((3 < (uint)uVar66 || fVar142 < 0.001) | bVar69) == 1) {
            lVar68 = 200;
            do {
              fVar75 = auVar209._0_4_;
              fVar102 = 1.0 - fVar75;
              fVar142 = fVar102 * fVar102 * fVar102;
              fVar101 = fVar75 * 3.0 * fVar102 * fVar102;
              fVar102 = fVar102 * fVar75 * fVar75 * 3.0;
              auVar151._4_4_ = fVar142;
              auVar151._0_4_ = fVar142;
              auVar151._8_4_ = fVar142;
              auVar151._12_4_ = fVar142;
              auVar111._4_4_ = fVar101;
              auVar111._0_4_ = fVar101;
              auVar111._8_4_ = fVar101;
              auVar111._12_4_ = fVar101;
              auVar94._4_4_ = fVar102;
              auVar94._0_4_ = fVar102;
              auVar94._8_4_ = fVar102;
              auVar94._12_4_ = fVar102;
              fVar75 = fVar75 * fVar75 * fVar75;
              local_650 = auVar5._0_4_;
              fStack_64c = auVar5._4_4_;
              fStack_648 = auVar5._8_4_;
              fStack_644 = auVar5._12_4_;
              auVar174._0_4_ = fVar75 * local_650;
              auVar174._4_4_ = fVar75 * fStack_64c;
              auVar174._8_4_ = fVar75 * fStack_648;
              auVar174._12_4_ = fVar75 * fStack_644;
              auVar14 = vfmadd231ps_fma(auVar174,local_500,auVar94);
              auVar14 = vfmadd231ps_fma(auVar14,auVar4,auVar111);
              auVar14 = vfmadd231ps_fma(auVar14,auVar3,auVar151);
              auVar95._8_8_ = auVar14._0_8_;
              auVar95._0_8_ = auVar14._0_8_;
              auVar14 = vshufpd_avx(auVar14,auVar14,3);
              auVar221 = vshufps_avx(auVar209,auVar209,0x55);
              auVar14 = vsubps_avx(auVar14,auVar95);
              auVar221 = vfmadd213ps_fma(auVar14,auVar221,auVar95);
              fVar142 = auVar221._0_4_;
              auVar14 = vshufps_avx(auVar221,auVar221,0x55);
              auVar96._0_4_ = fVar156 * fVar142 + fVar157 * auVar14._0_4_;
              auVar96._4_4_ = auVar278._4_4_ * fVar142 + auVar6._4_4_ * auVar14._4_4_;
              auVar96._8_4_ = auVar278._8_4_ * fVar142 + auVar6._8_4_ * auVar14._8_4_;
              auVar96._12_4_ = auVar278._12_4_ * fVar142 + auVar6._12_4_ * auVar14._12_4_;
              auVar209 = vsubps_avx(auVar209,auVar96);
              auVar14 = vandps_avx(auVar272,auVar221);
              auVar221 = vshufps_avx(auVar14,auVar14,0xf5);
              auVar14 = vmaxss_avx(auVar221,auVar14);
              if (auVar14._0_4_ < fVar85) {
                local_120 = auVar209._0_4_;
                if ((0.0 <= local_120) && (local_120 <= 1.0)) {
                  auVar14 = vmovshdup_avx(auVar209);
                  fVar142 = auVar14._0_4_;
                  if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
                    auVar278 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                             ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                             0x1c);
                    auVar77 = vinsertps_avx(auVar278,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar278 = vdpps_avx(auVar77,local_590,0x7f);
                    auVar6 = vdpps_avx(auVar77,local_5a0,0x7f);
                    auVar221 = vdpps_avx(auVar77,local_400,0x7f);
                    auVar108 = vdpps_avx(auVar77,local_410,0x7f);
                    auVar76 = vdpps_avx(auVar77,local_420,0x7f);
                    auVar21 = vdpps_avx(auVar77,local_430,0x7f);
                    auVar22 = vdpps_avx(auVar77,local_440,0x7f);
                    auVar77 = vdpps_avx(auVar77,local_450,0x7f);
                    fVar156 = 1.0 - fVar142;
                    auVar278 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * auVar76._0_4_)),
                                               ZEXT416((uint)fVar156),auVar278);
                    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * fVar142)),
                                             ZEXT416((uint)fVar156),auVar6);
                    auVar221 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ * fVar142)),
                                               ZEXT416((uint)fVar156),auVar221);
                    auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * auVar77._0_4_)),
                                               ZEXT416((uint)fVar156),auVar108);
                    fVar102 = 1.0 - local_120;
                    fVar156 = fVar102 * local_120 * local_120 * 3.0;
                    fVar182 = local_120 * local_120 * local_120;
                    auVar221 = vfmadd231ss_fma(ZEXT416((uint)(fVar182 * auVar108._0_4_)),
                                               ZEXT416((uint)fVar156),auVar221);
                    fVar157 = local_120 * 3.0 * fVar102 * fVar102;
                    auVar6 = vfmadd231ss_fma(auVar221,ZEXT416((uint)fVar157),auVar6);
                    fVar101 = fVar102 * fVar102 * fVar102;
                    auVar278 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar101),auVar278);
                    fVar75 = auVar278._0_4_;
                    if (((fVar73 <= fVar75) &&
                        (fVar158 = *(float *)(ray + k * 4 + 0x100), fVar75 <= fVar158)) &&
                       (pGVar9 = (context->scene->geometries).items[uVar62].ptr,
                       (pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                      auVar278 = vshufps_avx(auVar209,auVar209,0x55);
                      auVar228._8_4_ = 0x3f800000;
                      auVar228._0_8_ = &DAT_3f8000003f800000;
                      auVar228._12_4_ = 0x3f800000;
                      auVar6 = vsubps_avx(auVar228,auVar278);
                      fVar159 = auVar278._0_4_;
                      auVar236._0_4_ = fVar159 * (float)local_5c0._0_4_;
                      fVar250 = auVar278._4_4_;
                      auVar236._4_4_ = fVar250 * (float)local_5c0._4_4_;
                      fVar263 = auVar278._8_4_;
                      auVar236._8_4_ = fVar263 * fStack_5b8;
                      fVar264 = auVar278._12_4_;
                      auVar236._12_4_ = fVar264 * fStack_5b4;
                      auVar248._0_4_ = fVar159 * (float)local_600._0_4_;
                      auVar248._4_4_ = fVar250 * (float)local_600._4_4_;
                      auVar248._8_4_ = fVar263 * fStack_5f8;
                      auVar248._12_4_ = fVar264 * fStack_5f4;
                      auVar257._0_4_ = fVar159 * (float)local_610._0_4_;
                      auVar257._4_4_ = fVar250 * (float)local_610._4_4_;
                      auVar257._8_4_ = fVar263 * fStack_608;
                      auVar257._12_4_ = fVar264 * fStack_604;
                      auVar216._0_4_ = fVar159 * fVar160;
                      auVar216._4_4_ = fVar250 * fVar180;
                      auVar216._8_4_ = fVar263 * fVar183;
                      auVar216._12_4_ = fVar264 * fVar185;
                      auVar278 = vfmadd231ps_fma(auVar236,auVar6,local_5b0);
                      auVar221 = vfmadd231ps_fma(auVar248,auVar6,local_5e0);
                      auVar108 = vfmadd231ps_fma(auVar257,auVar6,local_5f0);
                      auVar76 = vfmadd231ps_fma(auVar216,auVar6,local_5d0);
                      auVar278 = vsubps_avx(auVar221,auVar278);
                      auVar6 = vsubps_avx(auVar108,auVar221);
                      auVar221 = vsubps_avx(auVar76,auVar108);
                      auVar258._0_4_ = local_120 * auVar6._0_4_;
                      auVar258._4_4_ = local_120 * auVar6._4_4_;
                      auVar258._8_4_ = local_120 * auVar6._8_4_;
                      auVar258._12_4_ = local_120 * auVar6._12_4_;
                      auVar200._4_4_ = fVar102;
                      auVar200._0_4_ = fVar102;
                      auVar200._8_4_ = fVar102;
                      auVar200._12_4_ = fVar102;
                      auVar278 = vfmadd231ps_fma(auVar258,auVar200,auVar278);
                      auVar217._0_4_ = local_120 * auVar221._0_4_;
                      auVar217._4_4_ = local_120 * auVar221._4_4_;
                      auVar217._8_4_ = local_120 * auVar221._8_4_;
                      auVar217._12_4_ = local_120 * auVar221._12_4_;
                      auVar6 = vfmadd231ps_fma(auVar217,auVar200,auVar6);
                      auVar218._0_4_ = local_120 * auVar6._0_4_;
                      auVar218._4_4_ = local_120 * auVar6._4_4_;
                      auVar218._8_4_ = local_120 * auVar6._8_4_;
                      auVar218._12_4_ = local_120 * auVar6._12_4_;
                      auVar6 = vfmadd231ps_fma(auVar218,auVar200,auVar278);
                      auVar175._0_4_ = fVar182 * (float)local_4a0._0_4_;
                      auVar175._4_4_ = fVar182 * (float)local_4a0._4_4_;
                      auVar175._8_4_ = fVar182 * fStack_498;
                      auVar175._12_4_ = fVar182 * fStack_494;
                      auVar124._4_4_ = fVar156;
                      auVar124._0_4_ = fVar156;
                      auVar124._8_4_ = fVar156;
                      auVar124._12_4_ = fVar156;
                      auVar278 = vfmadd132ps_fma(auVar124,auVar175,local_490);
                      auVar152._4_4_ = fVar157;
                      auVar152._0_4_ = fVar157;
                      auVar152._8_4_ = fVar157;
                      auVar152._12_4_ = fVar157;
                      auVar278 = vfmadd132ps_fma(auVar152,auVar278,local_480);
                      auVar176._0_4_ = auVar6._0_4_ * 3.0;
                      auVar176._4_4_ = auVar6._4_4_ * 3.0;
                      auVar176._8_4_ = auVar6._8_4_ * 3.0;
                      auVar176._12_4_ = auVar6._12_4_ * 3.0;
                      auVar138._4_4_ = fVar101;
                      auVar138._0_4_ = fVar101;
                      auVar138._8_4_ = fVar101;
                      auVar138._12_4_ = fVar101;
                      auVar6 = vfmadd132ps_fma(auVar138,auVar278,local_470);
                      auVar278 = vshufps_avx(auVar176,auVar176,0xc9);
                      auVar125._0_4_ = auVar6._0_4_ * auVar278._0_4_;
                      auVar125._4_4_ = auVar6._4_4_ * auVar278._4_4_;
                      auVar125._8_4_ = auVar6._8_4_ * auVar278._8_4_;
                      auVar125._12_4_ = auVar6._12_4_ * auVar278._12_4_;
                      auVar278 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar278 = vfmsub231ps_fma(auVar125,auVar176,auVar278);
                      local_140 = auVar278._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar75;
                        uVar74 = vextractps_avx(auVar278,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar74;
                        uVar74 = vextractps_avx(auVar278,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar74;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                        *(float *)(ray + k * 4 + 0x1e0) = local_120;
                        *(float *)(ray + k * 4 + 0x200) = fVar142;
                        *(uint *)(ray + k * 4 + 0x220) = uVar8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar62;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        local_100 = auVar14._0_8_;
                        auVar14 = vmovshdup_avx(auVar278);
                        local_180 = auVar14._0_8_;
                        auVar14 = vshufps_avx(auVar278,auVar278,0xaa);
                        local_160 = auVar14._0_8_;
                        uStack_178 = local_180;
                        uStack_170 = local_180;
                        uStack_168 = local_180;
                        uStack_158 = local_160;
                        uStack_150 = local_160;
                        uStack_148 = local_160;
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        uStack_f8 = local_100;
                        uStack_f0 = local_100;
                        uStack_e8 = local_100;
                        local_e0 = CONCAT44(uStack_35c,local_360);
                        uStack_d8 = CONCAT44(uStack_354,uStack_358);
                        uStack_d0 = CONCAT44(uStack_34c,uStack_350);
                        uStack_c8 = CONCAT44(uStack_344,uStack_348);
                        local_c0 = CONCAT44(uStack_33c,local_340);
                        uStack_b8 = CONCAT44(uStack_334,uStack_338);
                        uStack_b0 = CONCAT44(uStack_32c,uStack_330);
                        uStack_a8 = CONCAT44(uStack_324,uStack_328);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = fVar75;
                        local_4c0 = local_380._0_8_;
                        uStack_4b8 = local_380._8_8_;
                        uStack_4b0 = local_380._16_8_;
                        uStack_4a8 = local_380._24_8_;
                        local_640.valid = (int *)&local_4c0;
                        local_640.geometryUserPtr = pGVar9->userPtr;
                        local_640.context = context->user;
                        local_640.hit = (RTCHitN *)&local_180;
                        local_640.N = 8;
                        local_640.ray = (RTCRayN *)ray;
                        if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar81 = ZEXT1632(auVar81._0_16_);
                          (*pGVar9->intersectionFilterN)(&local_640);
                          auVar81 = vpcmpeqd_avx2(auVar81,auVar81);
                        }
                        auVar57._8_8_ = uStack_4b8;
                        auVar57._0_8_ = local_4c0;
                        auVar57._16_8_ = uStack_4b0;
                        auVar57._24_8_ = uStack_4a8;
                        auVar83 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar57);
                        auVar15 = auVar81 & ~auVar83;
                        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar15 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar15 >> 0x7f,0) == '\0') &&
                              (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar15 >> 0xbf,0) == '\0') &&
                            (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar15[0x1f]) {
                          auVar83 = auVar81 ^ auVar83;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar81 = ZEXT1632(auVar81._0_16_);
                            (*p_Var10)(&local_640);
                            auVar81 = vpcmpeqd_avx2(auVar81,auVar81);
                          }
                          auVar58._8_8_ = uStack_4b8;
                          auVar58._0_8_ = local_4c0;
                          auVar58._16_8_ = uStack_4b0;
                          auVar58._24_8_ = uStack_4a8;
                          auVar16 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar58
                                                 );
                          auVar83 = auVar81 ^ auVar16;
                          auVar15 = auVar81 & ~auVar16;
                          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar15 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar15 >> 0x7f,0) != '\0') ||
                                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar15 >> 0xbf,0) != '\0') ||
                              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar15[0x1f] < '\0') {
                            auVar100._0_4_ = auVar81._0_4_ ^ auVar16._0_4_;
                            auVar100._4_4_ = auVar81._4_4_ ^ auVar16._4_4_;
                            auVar100._8_4_ = auVar81._8_4_ ^ auVar16._8_4_;
                            auVar100._12_4_ = auVar81._12_4_ ^ auVar16._12_4_;
                            auVar100._16_4_ = auVar81._16_4_ ^ auVar16._16_4_;
                            auVar100._20_4_ = auVar81._20_4_ ^ auVar16._20_4_;
                            auVar100._24_4_ = auVar81._24_4_ ^ auVar16._24_4_;
                            auVar100._28_4_ = auVar81._28_4_ ^ auVar16._28_4_;
                            auVar81 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])local_640.hit);
                            *(undefined1 (*) [32])(local_640.ray + 0x180) = auVar81;
                            auVar81 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                               (local_640.hit + 0x20));
                            *(undefined1 (*) [32])(local_640.ray + 0x1a0) = auVar81;
                            auVar81 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                               (local_640.hit + 0x40));
                            *(undefined1 (*) [32])(local_640.ray + 0x1c0) = auVar81;
                            auVar81 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                               (local_640.hit + 0x60));
                            *(undefined1 (*) [32])(local_640.ray + 0x1e0) = auVar81;
                            auVar81 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                               (local_640.hit + 0x80));
                            *(undefined1 (*) [32])(local_640.ray + 0x200) = auVar81;
                            auVar81 = vpmaskmovd_avx2(auVar100,*(undefined1 (*) [32])
                                                                (local_640.hit + 0xa0));
                            *(undefined1 (*) [32])(local_640.ray + 0x220) = auVar81;
                            auVar81 = vpmaskmovd_avx2(auVar100,*(undefined1 (*) [32])
                                                                (local_640.hit + 0xc0));
                            *(undefined1 (*) [32])(local_640.ray + 0x240) = auVar81;
                            auVar81 = vpmaskmovd_avx2(auVar100,*(undefined1 (*) [32])
                                                                (local_640.hit + 0xe0));
                            *(undefined1 (*) [32])(local_640.ray + 0x260) = auVar81;
                            auVar81 = vpmaskmovd_avx2(auVar100,*(undefined1 (*) [32])
                                                                (local_640.hit + 0x100));
                            *(undefined1 (*) [32])(local_640.ray + 0x280) = auVar81;
                          }
                        }
                        if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar83 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar83 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar83 >> 0x7f,0) == '\0') &&
                              (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar83 >> 0xbf,0) == '\0') &&
                            (auVar83 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar83[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar158;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
          }
          else {
            bVar54 = false;
          }
        }
      }
    } while (bVar54);
    local_460 = vinsertps_avx(auVar13,ZEXT416((uint)fVar155),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }